

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu580.c
# Opt level: O1

MPP_RET hal_h265e_v580_gen_regs(void *hal,HalEncTask *task)

{
  ushort uVar1;
  ushort uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  EncRcTask *pEVar6;
  long lVar7;
  uint *puVar8;
  long lVar9;
  void *__s;
  uint *puVar10;
  EncRcTask *pEVar11;
  long lVar12;
  long *plVar13;
  RK_U8 aRVar14 [8];
  long lVar15;
  bool bVar16;
  RK_U32 RVar17;
  uint uVar18;
  uint uVar19;
  VepuRgb2YuvCfg *pVVar20;
  byte *pbVar21;
  size_t sVar22;
  void *pvVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  undefined8 *puVar33;
  char *fmt;
  hevc_vepu580_control_cfg *reg_ctl;
  byte bVar34;
  short sVar35;
  uint uVar36;
  int iVar37;
  uint uVar38;
  uint uVar39;
  RK_U32 *pRVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  RK_U32 *pRVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  ulong uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  ulong uVar54;
  uint uVar55;
  ulong size;
  uint uVar56;
  uint uVar57;
  undefined8 uVar58;
  double dVar59;
  
  bVar34 = 0;
  pEVar6 = task->rc_task;
  lVar7 = *(long *)((long)hal + 0xd0);
  puVar8 = *(uint **)((long)hal + 0x80);
  lVar9 = *(long *)((long)hal + 200);
  __s = *(void **)(puVar8 + 6);
  puVar10 = *(uint **)((long)hal + 0x110);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) enter\n",(char *)0x0,0xa85);
  }
  uVar1 = *(ushort *)(lVar7 + 4);
  uVar2 = *(ushort *)(lVar7 + 6);
  if (((byte)hal_h265e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","frame %d | type %d | start gen regs","hal_h265e_v580_gen_regs",
               (ulong)*puVar8,(ulong)*(uint *)((long)hal + 0xb0));
  }
  memset(__s,0,0x1d08);
  if (1 < *(int *)((long)hal + 0x94)) {
    lVar27 = *(long *)(*(long *)((long)hal + 0x80) + 0x18);
    uVar38 = 0x90030;
    if (*(int *)(*(long *)((long)hal + 0x80) + 4) == 2) {
      *(undefined8 *)((long)hal + 0x9c) = 0;
      uVar38 = 0x90010;
    }
    uVar25 = *(uint *)(lVar27 + 0xe4);
    uVar28 = *(uint *)((long)hal + 0x9c) & 3;
    *(uint *)(lVar27 + 0xe4) = uVar25 & 0xfffffffc | uVar28;
    *(uint *)(lVar27 + 0xe4) =
         (uVar25 & 0xf800ffc0 | uVar28 | uVar38) + (*(uint *)((long)hal + 0xa0) & 3) * 4;
    iVar37 = *(int *)((long)hal + 0x9c);
    *(int *)((long)hal + 0x9c) = iVar37 + 1;
    *(int *)((long)hal + 0xa0) = iVar37;
    if (2 < iVar37) {
      *(undefined4 *)((long)hal + 0x9c) = 0;
    }
  }
  uVar38 = *(uint *)((long)__s + 0x10);
  *(uint *)((long)__s + 0x10) = uVar38 & 0xffffff00;
  *(uint *)((long)__s + 0x10) = uVar38 & 0xfffffc00 | (*(uint *)((long)hal + 0x100) & 3) << 8;
  *(byte *)((long)__s + 0x14) = *(byte *)((long)__s + 0x14) & 0xfc;
  *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffc00 | 0x1f7;
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xe0000000 | 0x8007000;
  *(uint *)((long)__s + 0x34) =
       *(uint *)((long)__s + 0x34) & 0xff00ff7f | (uint)(*(int *)((long)hal + 0xb0) == 0) << 7;
  *(undefined4 *)((long)__s + 0x38) = 0x1fffff;
  *(byte *)((long)__s + 0x54) = *(byte *)((long)__s + 0x54) | 7;
  uVar56 = (uVar1 + 7 >> 3) - 1 & 0x7ff;
  uVar38 = *(uint *)((long)__s + 0xf0);
  *(uint *)((long)__s + 0xf0) = uVar38 & 0xfffff800 | uVar56;
  uVar28 = *(ushort *)(lVar7 + 4) & 7;
  uVar25 = 8 - uVar28;
  if ((*(ushort *)(lVar7 + 4) & 7) == 0) {
    uVar25 = uVar28;
  }
  uVar25 = *(uint *)((long)__s + 0xf4) & 0xffffffc0 | uVar25;
  *(uint *)((long)__s + 0xf4) = uVar25;
  *(uint *)((long)__s + 0xf0) =
       uVar38 & 0xf800f800 | uVar56 | (uint)uVar2 * 0x2000 + 0x7ffe000 & 0x7ff0000;
  uVar28 = *(ushort *)(lVar7 + 6) & 7;
  uVar38 = (8 - uVar28) * 0x10000;
  if ((*(ushort *)(lVar7 + 6) & 7) == 0) {
    uVar38 = uVar28;
  }
  *(uint *)((long)__s + 0xf4) = uVar25 & 0xffc0ffcf | uVar38;
  uVar38 = *(uint *)((long)__s + 0xe0);
  *(uint *)((long)__s + 0xe0) = uVar38 | 1;
  iVar37 = *(int *)(lVar7 + 0x120);
  dVar59 = log2((double)((uVar2 + 0x3f >> 6) * (uVar1 + 0x3f >> 6)));
  dVar59 = ceil(dVar59);
  *(uint *)((long)__s + 0xe0) =
       (((uint)(long)dVar59 & 0x1f) << 0x13 | uVar38 & 0xff07ffeb | 1) + (uint)(iVar37 == 0) * 4 +
       0x10;
  uVar38 = *(uint *)((long)__s + 0x10c);
  *(uint *)((long)__s + 0x10c) = uVar38 & 0xc3ffffff | 0x20000000;
  *(uint *)((long)__s + 0x10c) =
       uVar38 & 0x83ffffff | 0x20000000 | (uint)((*(uint *)(lVar7 + 0x10) & 0xf00000) != 0) << 0x1e;
  *(uint *)((long)__s + 600) =
       *(uint *)((long)__s + 600) & 0xfffffff8 | (uint)(*(int *)((long)hal + 0xb0) != 2) * 3;
  pRVar40 = klut_weight;
  pRVar46 = (RK_U32 *)((long)__s + 0x25c);
  for (lVar27 = 0x18; lVar27 != 0; lVar27 = lVar27 + -1) {
    *pRVar46 = *pRVar40;
    pRVar40 = pRVar40 + (ulong)bVar34 * -2 + 1;
    pRVar46 = pRVar46 + (ulong)bVar34 * -2 + 1;
  }
  uVar1 = *(ushort *)(lVar7 + 4);
  uVar38 = uVar1 & 0x1fc;
  if (0x17f < uVar1) {
    uVar38 = 0x180;
  }
  uVar25 = 0x300;
  if (uVar1 < 0x1bc) {
    uVar25 = uVar38;
  }
  uVar2 = *(ushort *)(lVar7 + 6);
  uVar38 = uVar2 & 0xfc;
  if (0xff < uVar2) {
    uVar38 = 0x100;
  }
  uVar28 = 0x200;
  if (uVar2 < 0x13c) {
    uVar28 = uVar38;
  }
  iVar42 = (int)-uVar25 >> 2;
  iVar37 = iVar42 + 3;
  if (-1 < iVar42) {
    iVar37 = iVar42;
  }
  uVar38 = iVar37 >> 2;
  iVar42 = (int)-uVar28 >> 2;
  iVar37 = iVar42 + 3;
  if (-1 < iVar42) {
    iVar37 = iVar42;
  }
  uVar56 = uVar1 + 0x3f;
  uVar43 = iVar37 >> 2;
  iVar42 = (int)(uVar25 - 4) >> 2;
  iVar37 = iVar42 + 3;
  if (-1 < iVar42) {
    iVar37 = iVar42;
  }
  iVar29 = (int)(uVar28 - 4) >> 2;
  iVar42 = iVar29 + 3;
  if (-1 < iVar29) {
    iVar42 = iVar29;
  }
  uVar25 = -uVar38;
  if (0 < (int)uVar38) {
    uVar25 = uVar38;
  }
  if (iVar37 >> 2 <= (int)uVar25) {
    uVar25 = iVar37 >> 2;
  }
  uVar38 = -uVar43;
  if (0 < (int)uVar43) {
    uVar38 = uVar43;
  }
  if (iVar42 >> 2 <= (int)uVar38) {
    uVar38 = iVar42 >> 2;
  }
  *(uint *)((long)__s + 0x150) =
       (*(uint *)((long)__s + 0x150) & 0xc000 | uVar25 >> 2 & 0xf) + (uVar38 & 0x3c) * 4 + 0x12f00;
  uVar43 = *(uint *)((long)__s + 0x154) & 0xfff00000;
  uVar28 = uVar43 + 0x80505;
  *(uint *)((long)__s + 0x154) = uVar28;
  if (((*(byte *)(lVar7 + 0x26) & 4) != 0) && (*(int *)((long)hal + 0xb0) != 2)) {
    uVar28 = uVar28 & 0xffc80505;
    if (*(int *)((long)hal + 0xb4) != 2) {
      uVar28 = uVar43 | 0x280505;
    }
    *(uint *)((long)__s + 0x154) = uVar28 | 0x100000;
  }
  uVar28 = uVar56 >> 6;
  if (*(ushort *)(lVar7 + 4) < 0xa81) {
    uVar43 = *(uint *)((long)__s + 0x158) & 0xffff07ff;
    if (*(ushort *)(lVar7 + 4) < 0x801) {
      uVar43 = uVar43 | 0xa000;
    }
    else {
      uVar43 = uVar43 | 0x8000;
    }
  }
  else {
    uVar43 = *(uint *)((long)__s + 0x158) & 0xffff07ff | 0x6000;
  }
  *(uint *)((long)__s + 0x158) = uVar43;
  uVar25 = (uVar25 >> 2 & 0xc) + 4 >> 1;
  uVar43 = (uVar38 >> 2 & 0xf) + 3 >> 1 | 1;
  uVar38 = *(uint *)((long)__s + 0x158) >> 0xd & 7;
  if (uVar43 <= uVar38) {
    uVar38 = uVar43;
  }
  iVar37 = uVar28 * 2;
  if (uVar25 < uVar28) {
    iVar37 = uVar25 + 1;
  }
  uVar38 = *(uint *)((long)__s + 0x158) & 0xfffcf800 | iVar37 + (uVar38 - 1) * uVar28 & 0x7ff;
  *(uint *)((long)__s + 0x158) = uVar38;
  uVar56 = uVar56 & 0xffffffc0;
  if (uVar56 < 0x201) {
LAB_00253432:
    *(uint *)((long)__s + 0x158) = uVar38;
  }
  else {
    if (uVar56 < 0x401) {
      uVar38 = uVar38 | 0x10000;
      goto LAB_00253432;
    }
    if (uVar56 < 0x801) {
      uVar38 = uVar38 | 0x20000;
      goto LAB_00253432;
    }
    if (uVar56 < 0x1001) {
      uVar38 = uVar38 | 0x30000;
      goto LAB_00253432;
    }
  }
  uVar38 = *(uint *)((long)__s + 0x180);
  *(uint *)((long)__s + 0x180) = uVar38 & 0xff878003 | 0x7836dc;
  uVar25 = uVar38 & 0xff878000 | 0x7836dc;
  uVar38 = uVar25 + 2;
  if (*(char *)(lVar7 + 0x1e) == '\0') {
    uVar38 = uVar25;
  }
  *(uint *)((long)__s + 0x180) = uVar38 | 0x800000;
  *(uint *)((long)__s + 0x180) =
       uVar38 & 0xfcffb6de | 0x800000 | (*(uint *)(lVar7 + 0x24) & 1) << 0x18;
  uVar38 = 1;
  if (*(int *)((long)hal + 0xb0) == 2) {
    uVar38 = 0x13;
  }
  uVar25 = 3;
  if (*(int *)(lVar7 + 0x124) == 0) {
    uVar25 = uVar38;
  }
  *(uint *)((long)__s + 400) = *(uint *)((long)__s + 400) & 0xffffffc0 | uVar25;
  vepu580_h265_set_hw_address((H265eV580HalContext *)hal,task);
  lVar27 = *(long *)((long)hal + 200);
  *(uint *)((long)__s + 0x30) = *(uint *)((long)__s + 0x30) & 0xffffff0f | (puVar10[4] & 0xf) << 4;
  uVar38 = (*(uint *)((long)__s + 0xf8) & 0xffffffc3) + (*puVar10 & 0xf) * 4;
  *(uint *)((long)__s + 0xf8) = uVar38;
  uVar25 = puVar10[1];
  *(uint *)((long)__s + 0xf8) = uVar38 & 0xfffffffe | uVar25 & 1;
  uVar38 = (uVar38 & 0xfffffffc | uVar25 & 1) + (puVar10[2] & 1) * 2;
  *(uint *)((long)__s + 0xf8) = uVar38;
  uVar56 = (uint)(*(int *)(lVar27 + 0x24) != 0xc) << 7;
  uVar28 = uVar38 & 0xffffff7f | uVar56;
  *(uint *)((long)__s + 0xf8) = uVar28;
  uVar25 = *(uint *)((long)__s + 0x10c);
  uVar43 = (uint)(0 < *(int *)(lVar27 + 0x58)) << 0x1a;
  *(uint *)((long)__s + 0x10c) = uVar25 & 0xfbffffff | uVar43;
  *(uint *)((long)__s + 0x10c) =
       uVar25 & 0xe3ffffff | uVar43 | (*(uint *)(lVar27 + 0x50) & 3) << 0x1b;
  if ((*(uint *)(lVar27 + 0x24) & 0xfffc) < 0x14 && (*(uint *)(lVar27 + 0x24) & 0xf0000) == 0) {
    uVar28 = uVar28 | 0x40;
  }
  else {
    uVar28 = uVar38 & 0xffffff3f | uVar56 | (uint)(*(int *)(lVar27 + 0x34) == 2) << 6;
  }
  *(uint *)((long)__s + 0xf8) = uVar28;
  if ((*(byte *)(lVar27 + 0x26) & 0xf0) == 0) {
    uVar38 = *(uint *)(lVar27 + 0x14);
    if (uVar38 == 0) {
      switch(*puVar10) {
      case 0:
        uVar38 = *(int *)(lVar27 + 0xc) << 2;
        break;
      case 1:
        uVar38 = *(int *)(lVar27 + 0xc) * 3;
        break;
      case 2:
      case 8:
      case 9:
        uVar38 = *(int *)(lVar27 + 0xc) * 2;
        break;
      default:
        uVar38 = *(uint *)(lVar27 + 0xc);
      }
    }
  }
  else {
    uVar38 = mpp_frame_get_fbc_hdr_stride(task->frame);
    if (uVar38 == 0) {
      uVar38 = *(int *)(lVar27 + 0xc) + 0xfU & 0xfffffff0;
    }
  }
  sVar35 = (short)uVar38;
  switch(*puVar10) {
  case 4:
  case 6:
  case 0xd:
    break;
  default:
    sVar35 = (short)((int)uVar38 / 2);
    break;
  case 0xc:
    sVar35 = sVar35 * 2;
  }
  if ((*(uint *)((long)__s + 0xf8) & 0x3c) < 0xc) {
    pVVar20 = get_rgb2yuv_cfg(*(MppFrameColorRange *)(lVar27 + 0x34),
                              *(MppFrameColorSpace *)(lVar27 + 0x28));
    if (((byte)hal_h265e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","input color range %d colorspace %d","vepu580_h265_set_pp_regs",
                 (ulong)*(uint *)(lVar27 + 0x34),(ulong)*(uint *)(lVar27 + 0x28));
    }
    uVar28 = ((ushort)(pVVar20->_2y).r_coeff & 0x1ff) << 0x12;
    uVar25 = *(uint *)((long)__s + 0xfc);
    *(uint *)((long)__s + 0xfc) = uVar25 & 0xf803ffff | uVar28;
    uVar56 = ((ushort)(pVVar20->_2y).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0xfc) = uVar25 & 0xf80001ff | uVar28 | uVar56;
    *(uint *)((long)__s + 0xfc) =
         uVar25 & 0xf8000000 | uVar28 | uVar56 | (ushort)(pVVar20->_2y).b_coeff & 0x1ff;
    uVar28 = ((ushort)(pVVar20->_2u).r_coeff & 0x1ff) << 0x12;
    uVar25 = *(uint *)((long)__s + 0x100);
    *(uint *)((long)__s + 0x100) = uVar25 & 0xf803ffff | uVar28;
    uVar56 = ((ushort)(pVVar20->_2u).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x100) = uVar25 & 0xf80001ff | uVar28 | uVar56;
    *(uint *)((long)__s + 0x100) =
         uVar25 & 0xf8000000 | uVar28 | uVar56 | (ushort)(pVVar20->_2u).b_coeff & 0x1ff;
    uVar25 = *(uint *)((long)__s + 0x104);
    uVar28 = ((ushort)(pVVar20->_2v).r_coeff & 0x1ff) << 0x12;
    *(uint *)((long)__s + 0x104) = uVar25 & 0xf803ffff | uVar28;
    uVar56 = ((ushort)(pVVar20->_2v).g_coeff & 0x1ff) << 9;
    *(uint *)((long)__s + 0x104) = uVar25 & 0xf80001ff | uVar28 | uVar56;
    *(uint *)((long)__s + 0x104) =
         uVar25 & 0xf8000000 | uVar28 | uVar56 | (ushort)(pVVar20->_2v).b_coeff & 0x1ff;
    uVar28 = ((ushort)(pVVar20->_2y).offset & 0x1f) << 0x10;
    uVar25 = *(uint *)((long)__s + 0x108);
    *(uint *)((long)__s + 0x108) = uVar25 & 0xffe0ffff | uVar28;
    uVar25 = uVar25 & 0xffe000ff | uVar28 | ((ushort)(pVVar20->_2u).offset & 0xff) << 8;
    *(uint *)((long)__s + 0x108) = uVar25;
    *(uint *)((long)__s + 0x108) = CONCAT31((int3)(uVar25 >> 8),(char)(pVVar20->_2v).offset);
    if (((byte)hal_h265e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","use color range %d colorspace %d","vepu580_h265_set_pp_regs",
                 (ulong)pVVar20->dst_range,(ulong)pVVar20->color);
    }
  }
  *(uint *)((long)__s + 0x114) = *(uint *)((long)__s + 0x114) & 0xfffe0000 | uVar38 & 0x1ffff;
  *(short *)((long)__s + 0x118) = sVar35;
  pEVar11 = task->rc_task;
  lVar27 = *(long *)((long)hal + 200);
  if (*(int *)(lVar27 + 0x94) == 2) {
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xffffc0ff | ((pEVar11->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x1a0) =
         *(uint *)((long)__s + 0x1a0) & 0xffc0ffff |
         ((pEVar11->info).quality_target & 0x3fU) << 0x10;
    uVar38 = *(uint *)((long)__s + 0x134);
    uVar25 = ((pEVar11->info).quality_target & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x134) = uVar38 & 0xfc0fffff | uVar25;
    *(uint *)((long)__s + 0x134) =
         uVar38 & 0xfffff | uVar25 | (pEVar11->info).quality_target << 0x1a;
  }
  else {
    uVar28 = *(ushort *)(*(long *)((long)hal + 0xd0) + 4) + 0x3f >> 6;
    uVar25 = ((pEVar11->info).bit_target << 4) /
             (int)((*(ushort *)(*(long *)((long)hal + 0xd0) + 6) + 0x3f >> 6) * uVar28);
    uVar38 = 0x50000;
    if (uVar25 < 0x100000) {
      uVar38 = uVar25;
    }
    uVar56 = (uVar38 * uVar28 >> 4) * 5 >> 4;
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xffffc0ff | ((pEVar11->info).quality_target & 0x3fU) << 8;
    *(uint *)((long)__s + 0x1a0) =
         *(uint *)((long)__s + 0x1a0) & 0xffc0ffff |
         ((pEVar11->info).quality_target & 0x3fU) << 0x10;
    *(uint *)((long)__s + 0x130) = uVar28 * 0x1000 + (*(uint *)((long)__s + 0x130) & 0xff8) + 7;
    uVar28 = (*(uint *)(lVar27 + 0x17c + (ulong)(*(int *)((long)hal + 0xb0) == 2) * 4) & 0xf) <<
             0x10;
    uVar25 = *(uint *)((long)__s + 0x134);
    *(uint *)((long)__s + 0x134) = uVar25 & 0xfff0ffff | uVar28;
    uVar43 = ((pEVar11->info).quality_max & 0x3fU) << 0x14;
    *(uint *)((long)__s + 0x134) = uVar25 & 0xfc00ffff | uVar28 | uVar43;
    uVar30 = (pEVar11->info).quality_min << 0x1a;
    *(uint *)((long)__s + 0x134) = uVar25 & 0xffff | uVar28 | uVar43 | uVar30;
    *(uint *)((long)__s + 0x138) = *(uint *)((long)__s + 0x138) & 0xfff00000 | uVar38 & 0xfffff;
    *(uint *)((long)__s + 0x1e0) = uVar56 * -2;
    *(uint *)((long)__s + 0x1e4) = -uVar56;
    *(uint *)((long)__s + 0x1e8) = uVar56;
    *(uint *)((long)__s + 0x1ec) = uVar56 * 2;
    *(undefined8 *)((long)__s + 0x1f0) = 0x7fffffff7fffffff;
    *(undefined8 *)((long)__s + 0x1f8) = 0x7fffffff7fffffff;
    *(undefined4 *)((long)__s + 0x200) = 0x7fffffff;
    *(uint *)((long)__s + 0x1d8) = *(uint *)((long)__s + 0x1d8) & 0xfe000000 | 0x2083fe;
    *(uint *)((long)__s + 0x1dc) = *(uint *)((long)__s + 0x1dc) & 0xfff00000;
    if (*(int *)(lVar27 + 0x94) == 4) {
      *(uint *)((long)__s + 0x134) = uVar25 & 0xffff | uVar43 | uVar30;
    }
  }
  uVar38 = (uint)*(byte *)(lVar27 + 0x3b0);
  if (*(byte *)(lVar27 + 0x3b0) == 0) {
    uVar38 = (pEVar11->info).quality_min;
  }
  uVar25 = *(uint *)((long)__s + 0x208);
  uVar38 = uVar38 & 0x3f;
  *(uint *)((long)__s + 0x208) = uVar25 & 0xffffffc0 | uVar38;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3a8);
  if (*(byte *)(lVar27 + 0x3a8) == 0) {
    uVar28 = (pEVar11->info).quality_max;
  }
  uVar56 = (uVar28 & 0x3f) << 6;
  *(uint *)((long)__s + 0x208) = uVar25 & 0xfffff000 | uVar38 | uVar56;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3b1);
  if (*(byte *)(lVar27 + 0x3b1) == 0) {
    uVar28 = (pEVar11->info).quality_min;
  }
  uVar43 = (uVar28 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x208) = uVar25 & 0xfffc0000 | uVar38 | uVar56 | uVar43;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3a9);
  if (*(byte *)(lVar27 + 0x3a9) == 0) {
    uVar28 = (pEVar11->info).quality_max;
  }
  uVar30 = (uVar28 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x208) = uVar25 & 0xff000000 | uVar38 | uVar56 | uVar43 | uVar30;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3b2);
  if (*(byte *)(lVar27 + 0x3b2) == 0) {
    uVar28 = (pEVar11->info).quality_min;
  }
  *(uint *)((long)__s + 0x208) =
       uVar25 & 0xc0000000 | uVar38 | uVar56 | uVar43 | uVar30 | (uVar28 & 0x3f) << 0x18;
  uVar38 = (uint)*(byte *)(lVar27 + 0x3aa);
  if (*(byte *)(lVar27 + 0x3aa) == 0) {
    uVar38 = (pEVar11->info).quality_max;
  }
  uVar25 = *(uint *)((long)__s + 0x20c);
  uVar38 = uVar38 & 0x3f;
  *(uint *)((long)__s + 0x20c) = uVar25 & 0xffffffc0 | uVar38;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3b3);
  if (*(byte *)(lVar27 + 0x3b3) == 0) {
    uVar28 = (pEVar11->info).quality_min;
  }
  uVar56 = (uVar28 & 0x3f) << 6;
  *(uint *)((long)__s + 0x20c) = uVar25 & 0xfffff000 | uVar38 | uVar56;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3ab);
  if (*(byte *)(lVar27 + 0x3ab) == 0) {
    uVar28 = (pEVar11->info).quality_max;
  }
  uVar43 = (uVar28 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x20c) = uVar25 & 0xfffc0000 | uVar38 | uVar56 | uVar43;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3b4);
  if (*(byte *)(lVar27 + 0x3b4) == 0) {
    uVar28 = (pEVar11->info).quality_min;
  }
  uVar30 = (uVar28 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x20c) = uVar25 & 0xff000000 | uVar38 | uVar56 | uVar43 | uVar30;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3ac);
  if (*(byte *)(lVar27 + 0x3ac) == 0) {
    uVar28 = (pEVar11->info).quality_max;
  }
  *(uint *)((long)__s + 0x20c) =
       uVar25 & 0xc0000000 | uVar38 | uVar56 | uVar43 | uVar30 | (uVar28 & 0x3f) << 0x18;
  uVar38 = (uint)*(byte *)(lVar27 + 0x3b5);
  if (*(byte *)(lVar27 + 0x3b5) == 0) {
    uVar38 = (pEVar11->info).quality_min;
  }
  uVar25 = *(uint *)((long)__s + 0x210);
  uVar38 = uVar38 & 0x3f;
  *(uint *)((long)__s + 0x210) = uVar25 & 0xffffffc0 | uVar38;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3ad);
  if (*(byte *)(lVar27 + 0x3ad) == 0) {
    uVar28 = (pEVar11->info).quality_max;
  }
  uVar56 = (uVar28 & 0x3f) << 6;
  *(uint *)((long)__s + 0x210) = uVar25 & 0xfffff000 | uVar38 | uVar56;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3b6);
  if (*(byte *)(lVar27 + 0x3b6) == 0) {
    uVar28 = (pEVar11->info).quality_min;
  }
  uVar43 = (uVar28 & 0x3f) << 0xc;
  *(uint *)((long)__s + 0x210) = uVar25 & 0xfffc0000 | uVar38 | uVar56 | uVar43;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3ae);
  if (*(byte *)(lVar27 + 0x3ae) == 0) {
    uVar28 = (pEVar11->info).quality_max;
  }
  uVar30 = (uVar28 & 0x3f) << 0x12;
  *(uint *)((long)__s + 0x210) = uVar25 & 0xff000000 | uVar38 | uVar56 | uVar43 | uVar30;
  uVar28 = (uint)*(byte *)(lVar27 + 0x3b7);
  if (*(byte *)(lVar27 + 0x3b7) == 0) {
    uVar28 = (pEVar11->info).quality_min;
  }
  *(uint *)((long)__s + 0x210) =
       uVar25 & 0xc0000000 | uVar38 | uVar56 | uVar43 | uVar30 | (uVar28 & 0x3f) << 0x18;
  uVar38 = (uint)*(byte *)(lVar27 + 0x3af);
  if (*(byte *)(lVar27 + 0x3af) == 0) {
    uVar38 = (pEVar11->info).quality_max;
  }
  uVar25 = *(uint *)((long)__s + 0x194);
  uVar28 = *(uint *)((long)__s + 0x214);
  *(uint *)((long)__s + 0x214) = uVar28 & 0xffffffc0 | uVar38 & 0x3f;
  *(uint *)((long)__s + 0x214) =
       uVar28 & 0x3fffffc0 | uVar38 & 0x3f | *(int *)(lVar27 + 0x3b8) << 0x1e;
  uVar38 = *(uint *)(lVar7 + 0x24) >> 2 & 1;
  *(uint *)((long)__s + 0x194) = uVar25 & 0xfffffffe | uVar38;
  uVar28 = (uint)(byte)(*(char *)(lVar7 + 0x1d) * '\x02');
  *(uint *)((long)__s + 0x194) = uVar25 & 0xffffff00 | uVar38 | uVar28;
  uVar56 = (*(byte *)(lVar7 + 0x1e) & 0x3f) << 9;
  *(uint *)((long)__s + 0x194) = uVar25 & 0xffff8100 | uVar38 | uVar28 | uVar56;
  uVar43 = *(uint *)(lVar7 + 0x24) >> 9 & 0x100;
  *(uint *)((long)__s + 0x194) = uVar25 & 0xffff8000 | uVar38 | uVar28 | uVar56 | uVar43;
  uVar30 = *(uint *)(lVar7 + 0x24) >> 3 & 0x8000;
  *(uint *)((long)__s + 0x194) = uVar25 & 0xffff0000 | uVar38 | uVar28 | uVar56 | uVar43 | uVar30;
  uVar39 = (*(uint *)(lVar7 + 0x14) & 0x1e00) << 7;
  *(uint *)((long)__s + 0x194) =
       uVar25 & 0xfff00000 | uVar38 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39;
  *(uint *)((long)__s + 0x194) =
       (uVar25 & 0xffe00000 | uVar38 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39) +
       (*(uint *)(lVar7 + 0x24) & 0x80000) * 2;
  uVar25 = *(uint *)(lVar7 + 0x24) >> 0x14 & 1;
  uVar38 = *(uint *)((long)__s + 0x198);
  *(uint *)((long)__s + 0x198) = uVar38 & 0xfffffffe | uVar25;
  uVar28 = *(uint *)(lVar7 + 0x24) >> 0x14 & 2;
  *(uint *)((long)__s + 0x198) = uVar38 & 0xfffffffc | uVar25 | uVar28;
  uVar56 = *(uint *)(lVar7 + 0x24) >> 0x14 & 0x1c;
  *(uint *)((long)__s + 0x198) = uVar38 & 0xffffffe0 | uVar25 | uVar28 | uVar56;
  uVar43 = *(uint *)(lVar7 + 0x24) >> 0x14 & 0x20;
  *(uint *)((long)__s + 0x198) = uVar38 & 0xffffffc0 | uVar25 | uVar28 | uVar56 | uVar43;
  uVar30 = *(uint *)(lVar7 + 0x24) >> 0x14 & 0x40;
  *(uint *)((long)__s + 0x198) = uVar38 & 0xffffff80 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30;
  uVar39 = (uint)(*(char *)(lVar7 + 0x21) + 0x1aU & 0x3f) << 7;
  *(uint *)((long)__s + 0x198) =
       uVar38 & 0xffffe000 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39;
  uVar31 = (*(uint *)(lVar7 + 0x28) & 4) << 0xb;
  *(uint *)((long)__s + 0x198) =
       uVar38 & 0xffffc000 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39 | uVar31;
  uVar48 = (*(uint *)(lVar7 + 0x28) & 8) << 0xb;
  *(uint *)((long)__s + 0x198) =
       uVar38 & 0xffff8000 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39 | uVar31 | uVar48;
  uVar49 = (*(uint *)(lVar7 + 0x28) & 0x800) << 4;
  *(uint *)((long)__s + 0x198) =
       uVar38 & 0xffff0000 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39 | uVar31 | uVar48 |
       uVar49;
  uVar47 = (*(uint *)(lVar7 + 0x28) & 0x1000) << 4;
  *(uint *)((long)__s + 0x198) =
       uVar38 & 0xfffe0000 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39 | uVar31 | uVar48 |
       uVar49 | uVar47;
  uVar38 = (uVar38 & 0xfffc0000 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39 | uVar31 |
            uVar48 | uVar49 | uVar47) + (*(uint *)(lVar7 + 0x28) & 0x4000) * 8;
  *(uint *)((long)__s + 0x198) = uVar38;
  uVar38 = (uVar38 & 0xfffbffff) + (*(uint *)(lVar7 + 0x28) & 0x8000) * 8;
  *(uint *)((long)__s + 0x198) = uVar38;
  uVar25 = (*(byte *)(lVar7 + 0xd0) & 3) << 0x13;
  *(uint *)((long)__s + 0x198) = uVar38 & 0xffe7ffff | uVar25;
  *(uint *)((long)__s + 0x198) =
       uVar38 & 0xffc7ffff | uVar25 | (*(uint *)(lVar7 + 0x28) & 0x400) << 0xb;
  uVar25 = *(uint *)(lVar7 + 0xe4) >> 4 & 1;
  uVar38 = *(uint *)((long)__s + 0x19c);
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xfffffffe | uVar25;
  uVar28 = *(uint *)(lVar7 + 0xe4) >> 4 & 2;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xfffffffc | uVar25 | uVar28;
  uVar56 = *(uint *)(lVar7 + 0xe4) >> 4 & 4;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xfffffff8 | uVar25 | uVar28 | uVar56;
  uVar43 = *(uint *)(lVar7 + 0xe4) >> 4 & 8;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xfffffff0 | uVar25 | uVar28 | uVar56 | uVar43;
  uVar30 = *(uint *)(lVar7 + 0xe4) >> 3 & 0x20;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xffffffd0 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30;
  uVar39 = (uint)(byte)(*(char *)(lVar7 + 0xf0) << 6);
  *(uint *)((long)__s + 0x19c) =
       uVar38 & 0xffffff10 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39;
  uVar31 = (*(byte *)(lVar7 + 0xf1) & 3) << 8;
  *(uint *)((long)__s + 0x19c) =
       uVar38 & 0xfffffc10 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39 | uVar31;
  uVar38 = (uVar38 & 0xfffff810 | uVar25 | uVar28 | uVar56 | uVar43 | uVar30 | uVar39 | uVar31) +
           (*(uint *)(lVar7 + 0xe4) & 0x200) * 2;
  *(uint *)((long)__s + 0x19c) = uVar38;
  uVar38 = (uVar38 & 0xfffff7ff) + (*(uint *)(lVar7 + 0xe4) & 0x400) * 2;
  *(uint *)((long)__s + 0x19c) = uVar38;
  uVar38 = (uVar38 & 0xffffefff) + (*(uint *)(lVar7 + 0xe4) & 0x800) * 2;
  *(uint *)((long)__s + 0x19c) = uVar38;
  uVar38 = (uVar38 & 0xffffdfff) + (*(uint *)(lVar7 + 0xe4) & 0x1000) * 2;
  *(uint *)((long)__s + 0x19c) = uVar38;
  *(uint *)((long)__s + 0xe0) =
       *(uint *)((long)__s + 0xe0) & 0xfff83fff | (*(uint *)(lVar7 + 0x11c) & 0x1f) << 0xe;
  uVar38 = (uVar38 & 0xffffbfff) + (*(uint *)(lVar7 + 0xe4) & 0x2000) * 2;
  *(uint *)((long)__s + 0x19c) = uVar38;
  uVar43 = (*(byte *)(lVar7 + 0xf2) & 3) << 0xf;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xfffe7fff | uVar43;
  uVar30 = (*(byte *)(lVar7 + 0xf3) & 0x7f) << 0x11;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xff007fff | uVar43 | uVar30;
  uVar39 = (*(uint *)(lVar7 + 0xe4) & 0x4000) << 10;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0xfe007fff | uVar43 | uVar30 | uVar39;
  uVar31 = (*(byte *)(lVar7 + 0xf4) & 0x3f) << 0x19;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0x80007fff | uVar43 | uVar30 | uVar39 | uVar31;
  uVar47 = (*(uint *)(lVar7 + 0xe4) & 0x8000) << 0x10;
  *(uint *)((long)__s + 0x19c) = uVar38 & 0x7fff | uVar43 | uVar30 | uVar39 | uVar31 | uVar47;
  uVar25 = *(uint *)((long)__s + 0x1a0);
  uVar48 = *(byte *)(lVar7 + 0xea) & 0xf;
  *(uint *)((long)__s + 0x1a0) = uVar25 & 0xfffffff0 | uVar48;
  uVar49 = (uint)(byte)(*(char *)(lVar7 + 0xeb) << 4);
  *(uint *)((long)__s + 0x1a0) = uVar25 & 0xffffff00 | uVar48 | uVar49;
  uVar51 = *(uint *)(lVar7 + 0xe4) >> 8 & 0x100;
  *(uint *)((long)__s + 0x1a0) = uVar25 & 0xfffffe00 | uVar48 | uVar49 | uVar51;
  uVar28 = *(uint *)(lVar7 + 0xe4) >> 8 & 0x200;
  *(uint *)((long)__s + 0x1a0) = uVar25 & 0xfffffc00 | uVar48 | uVar49 | uVar51 | uVar28;
  uVar56 = *(uint *)(lVar7 + 0xe4) >> 8 & 0x400;
  *(uint *)((long)__s + 0x1a0) = uVar25 & 0xfffff800 | uVar48 | uVar49 | uVar51 | uVar28 | uVar56;
  pbVar21 = (byte *)(lVar7 + 0xec);
  if ((*(byte *)(lVar7 + 0x28) & 8) == 0) {
    pbVar21 = (byte *)(lVar7 + 0x2c);
  }
  uVar18 = (*pbVar21 & 0x1f) << 0xb;
  *(uint *)((long)__s + 0x1a0) =
       uVar25 & 0xffff0000 | uVar48 | uVar49 | uVar51 | uVar28 | uVar56 | uVar18;
  uVar19 = (*(byte *)(lVar7 + 0xee) & 3) << 0x16;
  *(uint *)((long)__s + 0x1a0) =
       uVar25 & 0xff3f0000 | uVar48 | uVar49 | uVar51 | uVar28 | uVar56 | uVar18 | uVar19;
  uVar26 = (*(uint *)(lVar7 + 0xe4) & 0x80000) << 6;
  *(uint *)((long)__s + 0x1a0) =
       uVar25 & 0xfd3f0000 | uVar48 | uVar49 | uVar51 | uVar28 | uVar56 | uVar18 | uVar19 | uVar26;
  uVar52 = (*(uint *)(lVar7 + 0xe4) & 0x100000) << 6;
  *(uint *)((long)__s + 0x1a0) =
       uVar25 & 0xf93f0000 | uVar48 | uVar49 | uVar51 | uVar28 | uVar56 | uVar18 | uVar19 | uVar26 |
       uVar52;
  uVar36 = CONCAT22(*(undefined2 *)((long)__s + 0x1a6),*(undefined2 *)(lVar7 + 0xfc));
  *(uint *)((long)__s + 0x1a4) = uVar36;
  *(uint *)((long)__s + 0x1a4) = uVar36 & 0xfe00ffff | (*(ushort *)(lVar7 + 0xfe) & 0x1ff) << 0x10;
  uVar53 = *(uint *)(lVar7 + 0xe4) >> 0x15 & 1;
  uVar36 = *(uint *)((long)__s + 0x1a8);
  *(uint *)((long)__s + 0x1a8) = uVar36 & 0xfffffffe | uVar53;
  uVar36 = (uVar36 & 0xfffe0000 | uVar53) + (uint)*(ushort *)(lVar7 + 0x100) * 2;
  *(uint *)((long)__s + 0x1a8) = uVar36;
  *(uint *)((long)__s + 0x1a8) = uVar36 & 0xff3fffff | (*(byte *)(lVar7 + 0xf6) & 3) << 0x16;
  uVar36 = (*(uint *)((long)__s + 0x1ac) & 0xfbffffff) + (*(uint *)(lVar7 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar53 = (uint)*(ushort *)(lVar7 + 0x106) << 10;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfc0003ff | uVar53;
  uVar36 = (uVar36 & 0xdc0003ff | uVar53) + (*(uint *)(lVar7 + 0xe4) & 0x4000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar36 = (uVar36 & 0xbfffffff) + (*(uint *)(lVar7 + 0xe4) & 0x8000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar36 = (uVar36 & 0x7fffffff) + (*(uint *)(lVar7 + 0xe4) & 0xf0000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar36 = (uVar36 & 0xfbffffff) + (*(uint *)(lVar7 + 0xe4) & 0x800000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar53 = (uint)*(ushort *)(lVar7 + 0x106) << 10;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfc0003ff | uVar53;
  uVar36 = (uVar36 & 0xf40003ff | uVar53) + (*(uint *)(lVar7 + 0xe4) & 0x1000000) * 8;
  *(uint *)((long)__s + 0x1ac) = uVar36;
  uVar53 = (*(byte *)(lVar7 + 0xfa) & 0x1f) << 5;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfffffc1f | uVar53;
  uVar44 = *(uint *)(lVar7 + 0xe4) >> 0x12 & 0x10;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfffffc0f | uVar53 | uVar44;
  uVar45 = *(byte *)(lVar7 + 0xf9) & 0xf;
  *(uint *)((long)__s + 0x1ac) = uVar36 & 0xfffffc00 | uVar53 | uVar44 | uVar45;
  uVar3 = *(undefined2 *)(lVar7 + 0x108);
  *(undefined2 *)((long)__s + 0x1b0) = uVar3;
  *(uint *)((long)__s + 0x1b0) = CONCAT22(*(undefined2 *)(lVar7 + 0x10a),uVar3);
  uVar3 = *(undefined2 *)(lVar7 + 0x10c);
  *(undefined2 *)((long)__s + 0x1b4) = uVar3;
  *(uint *)((long)__s + 0x1b4) = CONCAT22(*(undefined2 *)(lVar7 + 0x10e),uVar3);
  uVar3 = *(undefined2 *)(lVar7 + 0x110);
  *(undefined2 *)((long)__s + 0x1b8) = uVar3;
  uVar4 = *(undefined2 *)(lVar7 + 0x114);
  *(undefined2 *)((long)__s + 0x1bc) = uVar4;
  *(uint *)((long)__s + 0x1b8) = CONCAT22(*(undefined2 *)(lVar7 + 0x112),uVar3);
  *(uint *)((long)__s + 0x1ac) =
       (uVar36 & 0xeffffc00 | uVar53 | uVar44 | uVar45) + (*(uint *)(lVar7 + 0xe4) & 0x2000000) * 8;
  *(uint *)((long)__s + 0x1bc) = CONCAT22(*(undefined2 *)(lVar7 + 0x116),uVar4);
  *(uint *)((long)__s + 0x1a0) =
       uVar25 & 0x813f0000 | uVar48 | uVar49 | uVar51 | uVar28 | uVar56 | uVar18 | uVar19 | uVar26 |
       uVar52 | (*(byte *)(lVar7 + 0xef) & 0xf) << 0x1b;
  *(uint *)((long)__s + 0x19c) =
       uVar38 & 0x7fdf | uVar43 | uVar30 | uVar39 | uVar31 | uVar47 |
       *(uint *)(lVar7 + 0xe4) >> 3 & 0x20;
  vepu580_set_osd((Vepu541OsdCfg *)(*(long *)((long)hal + 0x80) + 0x1c8));
  puVar33 = *(undefined8 **)(*(long *)((long)hal + 0x80) + 0x1f8);
  if (puVar33 != (undefined8 *)0x0) {
    iVar37 = (*(int *)(*(long *)((long)hal + 200) + 0x10) + 0x3f >> 6) *
             (*(int *)(*(long *)((long)hal + 200) + 0xc) + 0x3f >> 6);
    sVar22 = mpp_buffer_get_size_with_caller((MppBuffer)*puVar33,"vepu580_h265_set_roi_regs");
    if (sVar22 < (uint)(iVar37 * 0x40)) {
      _mpp_log_l(2,"hal_h265e_v580","roi base cfg buf not enough, roi is invalid",(char *)0x0);
    }
    else {
      *(byte *)((long)__s + 0xe0) = *(byte *)((long)__s + 0xe0) | 2;
      iVar42 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar33,"vepu580_h265_set_roi_regs");
      *(int *)((long)__s + 0xa8) = iVar42;
    }
    if ((*(byte *)(puVar33 + 4) & 1) != 0) {
      sVar22 = mpp_buffer_get_size_with_caller((MppBuffer)puVar33[1],"vepu580_h265_set_roi_regs");
      if (sVar22 < (uint)(iVar37 * 0x100)) {
        _mpp_log_l(2,"hal_h265e_v580","roi qp cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar42 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar33[1],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xac) = iVar42;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 1;
      }
    }
    if ((*(byte *)(puVar33 + 4) & 2) != 0) {
      sVar22 = mpp_buffer_get_size_with_caller((MppBuffer)puVar33[2],"vepu580_h265_set_roi_regs");
      if (sVar22 < (uint)(iVar37 * 0x200)) {
        _mpp_log_l(2,"hal_h265e_v580","roi amv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar42 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar33[2],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xb0) = iVar42;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 2;
      }
    }
    if ((*(byte *)(puVar33 + 4) & 4) != 0) {
      sVar22 = mpp_buffer_get_size_with_caller((MppBuffer)puVar33[3],"vepu580_h265_set_roi_regs");
      if (sVar22 < (uint)(iVar37 * 4)) {
        _mpp_log_l(2,"hal_h265e_v580","roi mv cfg buf not enough, roi is invalid",(char *)0x0);
      }
      else {
        iVar37 = mpp_buffer_get_fd_with_caller((MppBuffer)puVar33[3],"vepu580_h265_set_roi_regs");
        *(int *)((long)__s + 0xb4) = iVar37;
        *(byte *)((long)__s + 0x170) = *(byte *)((long)__s + 0x170) | 4;
      }
    }
  }
  uVar41 = (pEVar6->frm).val;
  if ((uVar41 >> 0x26 & 1) != 0) {
    lVar27 = *(long *)((long)hal + 0x80);
    lVar24 = *(long *)((long)hal + 200);
    uVar41 = (long)(uVar41 >> 0x30) % (long)*(int *)(lVar24 + 0xc4);
    uVar32 = uVar41 & 0xffffffff;
    lVar12 = *(long *)(lVar27 + 0x18);
    puVar33 = *(undefined8 **)(lVar27 + 0x1f8);
    iVar37 = *(int *)(lVar24 + 0xc);
    iVar42 = *(int *)(lVar24 + 0x10);
    if (((byte)hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","enter\n","setup_intra_refresh");
    }
    if (*(int *)(*(long *)((long)hal + 200) + 0x164) == 0) {
      uVar38 = 0xfffffffa;
    }
    else {
      uVar25 = iVar37 + 0x3f;
      uVar56 = iVar42 + 0x3f;
      uVar28 = uVar56 >> 6;
      uVar38 = (uVar25 & 0xffffffc0) * uVar28;
      size = (ulong)uVar38;
      if (*(long *)(lVar27 + 0x1f8) == 0) {
        if (*(int *)(lVar27 + 0x210) < (int)uVar38) {
          if (*(long *)((long)hal + 0xb8) == 0) {
            mpp_buffer_group_get
                      ((MppBufferGroup *)((long)hal + 0xb8),MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,
                       "hal_h265e_v580","setup_intra_refresh");
          }
          if (*(MppBuffer *)(lVar27 + 0x200) != (MppBuffer)0x0) {
            mpp_buffer_put_with_caller(*(MppBuffer *)(lVar27 + 0x200),"setup_intra_refresh");
          }
          if (*(void **)(lVar27 + 0x208) != (void *)0x0) {
            mpp_osal_free("setup_intra_refresh",*(void **)(lVar27 + 0x208));
          }
          *(undefined8 *)(lVar27 + 0x208) = 0;
          pvVar23 = mpp_osal_malloc("setup_intra_refresh",size);
          *(void **)(lVar27 + 0x208) = pvVar23;
          mpp_buffer_get_with_tag
                    (*(MppBufferGroup *)((long)hal + 0xb8),(MppBuffer *)(lVar27 + 0x200),size,
                     "hal_h265e_v580","setup_intra_refresh");
        }
        puVar33 = (undefined8 *)(lVar27 + 0x200);
      }
      uVar43 = uVar25 >> 6;
      pvVar23 = mpp_buffer_get_ptr_with_caller((MppBuffer)*puVar33,"setup_intra_refresh");
      iVar37 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar33,"setup_intra_refresh");
      *(uint *)(lVar27 + 0x210) = uVar38;
      memset(*(void **)(lVar27 + 0x208),0,size);
      uVar38 = *(uint *)(*(long *)((long)hal + 200) + 0x16c);
      iVar42 = (int)uVar41;
      uVar41 = (ulong)(uVar38 * iVar42 - 1);
      if (iVar42 == 0) {
        uVar41 = uVar32;
      }
      uVar39 = (uint)uVar41;
      uVar30 = (uVar38 - (iVar42 == 0)) + uVar39;
      if (*(int *)(*(long *)((long)hal + 200) + 0x168) == 0) {
        uVar31 = uVar43 - 1;
        uVar39 = 0;
      }
      else {
        uVar41 = 0;
        uVar31 = uVar30;
        uVar30 = uVar28 - 1;
      }
      uVar47 = uVar43 - 1;
      if ((int)uVar31 < (int)uVar43) {
        uVar47 = uVar31;
      }
      uVar31 = uVar28 - 1;
      if ((int)uVar30 < (int)uVar28) {
        uVar31 = uVar30;
      }
      if (((byte)hal_h265e_debug & 8) != 0) {
        uVar54 = 0;
        if (0 < (int)uVar39) {
          uVar54 = (ulong)uVar39;
        }
        uVar50 = 0;
        if (0 < (int)uVar41) {
          uVar50 = uVar41;
        }
        _mpp_log_l(4,"hal_h265e_v580",
                   "size in ctu : %d x %d, refresh_num %d, refresh_idx %d, area x[%d, %d], y[%d, %d]"
                   ,(char *)0x0,(ulong)uVar43,(ulong)uVar28,(ulong)uVar38,uVar32,uVar54,
                   (ulong)uVar47,uVar50,(ulong)uVar31);
      }
      if (0x3f < uVar56) {
        lVar24 = *(long *)(lVar27 + 0x208);
        uVar38 = 0;
        do {
          if (0x3f < uVar25) {
            uVar56 = 0;
            do {
              if (((int)uVar56 <= (int)uVar47 &&
                   ((int)uVar41 <= (int)uVar38 && (int)uVar38 <= (int)uVar31)) &&
                 ((int)uVar39 <= (int)uVar56)) {
                *(undefined8 *)(lVar24 + 0x16) = 0x5555555555555555;
                *(undefined8 *)(lVar24 + 0x1e) = 0x5555555555555555;
                *(undefined4 *)(lVar24 + 0x26) = 0x55555555;
                *(undefined1 *)(lVar24 + 0x15) = 0x54;
                *(undefined1 *)(lVar24 + 0x2a) = 5;
              }
              lVar24 = lVar24 + 0x40;
              uVar56 = uVar56 + 1;
            } while (uVar43 != uVar56);
          }
          uVar38 = uVar38 + 1;
        } while (uVar38 != uVar28);
      }
      memcpy(pvVar23,*(void **)(lVar27 + 0x208),size);
      iVar42 = *(int *)(*(long *)((long)hal + 200) + 0x168);
      if (iVar42 == 0) {
        uVar38 = 0x10;
        uVar25 = 0xffffff0f;
LAB_00254a57:
        *(uint *)(lVar12 + 0x150) = uVar25 & *(uint *)(lVar12 + 0x150) | uVar38;
      }
      else if (iVar42 == 1) {
        uVar38 = 1;
        uVar25 = 0xfffffff0;
        goto LAB_00254a57;
      }
      *(byte *)(lVar12 + 0xe0) = *(byte *)(lVar12 + 0xe0) | 2;
      *(int *)(lVar12 + 0xa8) = iVar37;
      uVar38 = 0;
      mpp_buffer_sync_end_f(*(MppBuffer *)(lVar27 + 0x200),0,"setup_intra_refresh");
    }
    if (((byte)hal_h265e_debug & 1) != 0) {
      _mpp_log_l(4,"hal_h265e_v580","leave, ret %d\n","setup_intra_refresh",(ulong)uVar38);
    }
  }
  if ((((*(int *)(lVar9 + 0x1868) == 0) || ((pEVar6->info).complex_scene != 0)) ||
      (*(int *)(lVar9 + 0x94) != 4)) ||
     ((task->md_info == (MppBuffer)0x0 || (*(int *)(lVar9 + 0x1864) != 1)))) goto LAB_00254cc5;
  lVar27 = *(long *)((long)hal + 200);
  iVar37 = (*(int *)(lVar27 + 0x10) + 0x3f >> 6) * (*(int *)(lVar27 + 0xc) + 0x3f >> 6);
  *(int *)((long)hal + 0x17c) = iVar37 * 0x40;
  *(int *)((long)hal + 0x180) = iVar37 * 0xc0;
  *(int *)((long)hal + 0x184) = iVar37 * 0x10;
  if (*(int *)(lVar27 + 0x1868) == 0) {
    uVar58 = 0;
    _mpp_log_l(4,"hal_h265e_v580","deblurring is closed!\n",(char *)0x0);
    bVar16 = true;
    goto LAB_00254c74;
  }
  if ((*(long *)((long)hal + 0x160) == 0) &&
     (mpp_buffer_get_with_tag
                ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x160),(long)(iVar37 * 0x40),
                 "hal_h265e_v580","vepu580_setup_qpmap_buf"),
     *(MppBuffer *)((long)hal + 0x160) == (MppBuffer)0x0)) {
    fmt = "qpmap_base_cfg_buf malloc fail, qpmap invalid\n";
LAB_00254c5d:
    bVar16 = false;
    _mpp_log_l(2,"hal_h265e_v580",fmt,(char *)0x0);
    uVar58 = 0xfffffffa;
  }
  else {
    if ((*(long *)((long)hal + 0x168) == 0) &&
       (mpp_buffer_get_with_tag
                  ((MppBufferGroup)0x0,(MppBuffer *)((long)hal + 0x168),(long)(iVar37 * 0xc0),
                   "hal_h265e_v580","vepu580_setup_qpmap_buf"),
       *(MppBuffer *)((long)hal + 0x168) == (MppBuffer)0x0)) {
      fmt = "qpmap_qp_cfg_buf malloc fail, qpmap invalid\n";
      goto LAB_00254c5d;
    }
    uVar58 = 0;
    bVar16 = true;
    if (*(long *)((long)hal + 0x170) == 0) {
      pvVar23 = mpp_osal_malloc("vepu580_setup_qpmap_buf",(long)(iVar37 * 0x10));
      *(void **)((long)hal + 0x170) = pvVar23;
      if (pvVar23 == (void *)0x0) {
        fmt = "md_flag_buf malloc fail, qpmap invalid\n";
        goto LAB_00254c5d;
      }
    }
  }
LAB_00254c74:
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave, ret %d\n","vepu580_setup_qpmap_buf",uVar58);
  }
  if (!bVar16) {
    _mpp_log_l(2,"hal_h265e_v580","qpmap malloc buffer failed!\n",(char *)0x0);
  }
LAB_00254cc5:
  lVar27 = *(long *)((long)hal + 200);
  *(uint *)((long)__s + 0x6bc) = *(uint *)((long)__s + 0x6bc) & 0xc0000000 | 0xe34c2ca;
  *(uint *)((long)__s + 0x6c0) = *(uint *)((long)__s + 0x6c0) & 0xc0000000 | 0x74083c9;
  *(uint *)((long)__s + 0x6c4) = *(uint *)((long)__s + 0x6c4) & 0xc0000000 | 0x61c824a;
  *(uint *)((long)__s + 0x6c8) = *(uint *)((long)__s + 0x6c8) & 0xc0000000 | 0xd10c14b;
  *(uint *)((long)__s + 0x6cc) = *(uint *)((long)__s + 0x6cc) & 0xc0000000 | 0xe3d0452;
  *(uint *)((long)__s + 0x6d0) = *(uint *)((long)__s + 0x6d0) & 0xc0000000 | 0x15314353;
  *(uint *)((long)__s + 0x6d4) = *(uint *)((long)__s + 0x6d4) & 0xc0000000 | 0x165544d2;
  *(uint *)((long)__s + 0x6d8) = *(uint *)((long)__s + 0x6d8) & 0xc0000000 | 0xf6105d1;
  *(uint *)((long)__s + 0x6dc) = *(uint *)((long)__s + 0x6dc) & 0xc0000000 | 0x165d8699;
  *(uint *)((long)__s + 0x6e0) = *(uint *)((long)__s + 0x6e0) & 0xc0000000 | 0x1d51c55b;
  *(uint *)((long)__s + 0x6e4) = *(uint *)((long)__s + 0x6e4) & 0xc0000000 | 0x1e75c69b;
  *(uint *)((long)__s + 0x6e8) = *(uint *)((long)__s + 0x6e8) & 0xc0000000 | 0x178187d9;
  *(uint *)((long)__s + 0x6ec) = *(uint *)((long)__s + 0x6ec) & 0xc0000000 | 0x1e7e0862;
  *(uint *)((long)__s + 0x6f0) = *(uint *)((long)__s + 0x6f0) & 0xc0000000 | 0x4703742;
  *(uint *)((long)__s + 0x6f4) = *(uint *)((long)__s + 0x6f4) & 0xc0000000 | 0x51030a2;
  *(uint *)((long)__s + 0x6f8) = *(uint *)((long)__s + 0x6f8) & 0xc0000000 | 0x1f1e01a1;
  *(uint *)((long)__s + 0x6fc) = *(uint *)((long)__s + 0x6fc) & 0xc0000000 | 0x689268a;
  *(uint *)((long)__s + 0x700) = *(uint *)((long)__s + 0x700) & 0xc0000000 | 0x1809e58e;
  *(uint *)((long)__s + 0x704) = *(uint *)((long)__s + 0x704) & 0xc0000000;
  *(uint *)((long)__s + 0x708) = *(uint *)((long)__s + 0x708) & 0xc0000000;
  *(uint *)((long)__s + 0x70c) = *(uint *)((long)__s + 0x70c) & 0xc0000000;
  *(uint *)((long)__s + 0x710) = *(uint *)((long)__s + 0x710) & 0xc0000000;
  *(uint *)((long)__s + 0x714) = *(uint *)((long)__s + 0x714) & 0xc0000000;
  *(uint *)((long)__s + 0x718) = *(uint *)((long)__s + 0x718) & 0xc0000000;
  *(uint *)((long)__s + 0x71c) = *(uint *)((long)__s + 0x71c) & 0xc0000000;
  *(uint *)((long)__s + 0x720) = *(uint *)((long)__s + 0x720) & 0xc0000000;
  *(uint *)((long)__s + 0x724) = *(uint *)((long)__s + 0x724) & 0xc0000000;
  *(uint *)((long)__s + 0x728) = *(uint *)((long)__s + 0x728) & 0xc0000000;
  *(uint *)((long)__s + 0x72c) = *(uint *)((long)__s + 0x72c) & 0xc0000000;
  *(uint *)((long)__s + 0x730) = *(uint *)((long)__s + 0x730) & 0xc0000000;
  *(uint *)((long)__s + 0x734) = *(uint *)((long)__s + 0x734) & 0xc0000000;
  *(uint *)((long)__s + 0x738) = *(uint *)((long)__s + 0x738) & 0xc0000000;
  *(uint *)((long)__s + 0x73c) = *(uint *)((long)__s + 0x73c) & 0xc0000000;
  *(uint *)((long)__s + 0x740) = *(uint *)((long)__s + 0x740) & 0xc0000000;
  *(uint *)((long)__s + 0x7bc) = *(uint *)((long)__s + 0x7bc) & 0xf000f000 | 0xc80040;
  *(uint *)((long)__s + 0x7c0) = *(uint *)((long)__s + 0x7c0) & 0xc0000000 | 0x20820820;
  *(uint *)((long)__s + 0x7c4) = (uint)*(byte *)((long)__s + 0x7c7) << 0x18 | 0x820820;
  *(uint *)((long)__s + 0x7c8) = *(uint *)((long)__s + 0x7c8) & 0x80008000;
  *(uint *)((long)__s + 0x7cc) = *(uint *)((long)__s + 0x7cc) & 0x80008000;
  *(uint *)((long)__s + 2000) = *(uint *)((long)__s + 2000) & 0x80008000;
  *(uint *)((long)__s + 0x7d4) = *(uint *)((long)__s + 0x7d4) & 0x80008000;
  *(uint *)((long)__s + 0x7d8) = *(uint *)((long)__s + 0x7d8) & 0xffff8000;
  *(uint *)((long)__s + 0x7dc) = *(uint *)((long)__s + 0x7dc) & 0xc0000000 | 0xd34d34d;
  *(uint *)((long)__s + 0x7e0) = (uint)*(byte *)((long)__s + 0x7e3) << 0x18 | 0x34d34d;
  *(uint *)((long)__s + 0x7e4) = *(uint *)((long)__s + 0x7e4) & 0x80008000 | 0x5cc65cc6;
  *(uint *)((long)__s + 0x7e8) = *(uint *)((long)__s + 0x7e8) & 0x80008000 | 0x5cc65cc6;
  *(uint *)((long)__s + 0x7ec) = *(uint *)((long)__s + 0x7ec) & 0x80008000 | 0x5cc65cc6;
  *(uint *)((long)__s + 0x7f0) = *(uint *)((long)__s + 0x7f0) & 0x80008000 | 0x5cc65cc6;
  *(uint *)((long)__s + 0x7f4) = *(uint *)((long)__s + 0x7f4) & 0xffff8000 | 0x5cc6;
  *(undefined4 *)((long)__s + 0x7f8) = 20000;
  *(undefined4 *)((long)__s + 0x800) = 20000;
  *(undefined4 *)((long)__s + 0x808) = 20000;
  *(undefined4 *)((long)__s + 0x810) = 20000;
  *(undefined4 *)((long)__s + 0x818) = 20000;
  *(undefined4 *)((long)__s + 0x820) = 20000;
  *(undefined4 *)((long)__s + 0x828) = 20000;
  *(undefined4 *)((long)__s + 0x830) = 20000;
  *(undefined4 *)((long)__s + 0x838) = 20000;
  *(byte *)((long)__s + 0x7fc) = *(byte *)((long)__s + 0x7fc) & 0xfc;
  *(byte *)((long)__s + 0x804) = *(byte *)((long)__s + 0x804) & 0xfc;
  *(byte *)((long)__s + 0x80c) = *(byte *)((long)__s + 0x80c) & 0xfc;
  *(byte *)((long)__s + 0x814) = *(byte *)((long)__s + 0x814) & 0xfc;
  *(byte *)((long)__s + 0x81c) = *(byte *)((long)__s + 0x81c) & 0xfc;
  *(byte *)((long)__s + 0x824) = *(byte *)((long)__s + 0x824) & 0xfc;
  *(byte *)((long)__s + 0x82c) = *(byte *)((long)__s + 0x82c) & 0xfc;
  *(byte *)((long)__s + 0x834) = *(byte *)((long)__s + 0x834) & 0xfc;
  *(byte *)((long)__s + 0x83c) = *(byte *)((long)__s + 0x83c) & 0xfc;
  *(uint *)((long)__s + 0x840) = *(uint *)((long)__s + 0x840) & 0xf000f000 | 0x1900040;
  *(uint *)((long)__s + 0x844) = *(uint *)((long)__s + 0x844) & 0xffffffc0 | 8;
  *(uint *)((long)__s + 0x848) = *(uint *)((long)__s + 0x848) & 0xf000f000 | 0x640064;
  *(uint *)((long)__s + 0x84c) = *(uint *)((long)__s + 0x84c) & 0xc0000000 | 0x12492492;
  *(uint *)((long)__s + 0x850) = *(uint *)((long)__s + 0x850) & 0x80008000;
  *(uint *)((long)__s + 0x854) = *(uint *)((long)__s + 0x854) & 0x80008000;
  *(uint *)((long)__s + 0x858) = *(uint *)((long)__s + 0x858) & 0xffff8000;
  *(uint *)((long)__s + 0x85c) = *(uint *)((long)__s + 0x85c) & 0xc0000000 | 0x10410410;
  *(uint *)((long)__s + 0x860) = *(uint *)((long)__s + 0x860) & 0x80008000;
  *(uint *)((long)__s + 0x864) = *(uint *)((long)__s + 0x864) & 0x80008000;
  *(uint *)((long)__s + 0x868) = *(uint *)((long)__s + 0x868) & 0xffff8000;
  *(undefined4 *)((long)__s + 0x86c) = 20000;
  *(undefined4 *)((long)__s + 0x874) = 20000;
  *(undefined4 *)((long)__s + 0x87c) = 20000;
  *(undefined4 *)((long)__s + 0x884) = 20000;
  *(undefined4 *)((long)__s + 0x88c) = 20000;
  *(uint *)((long)__s + 0x870) = *(uint *)((long)__s + 0x870) & 0xfffffe00;
  *(uint *)((long)__s + 0x878) = *(uint *)((long)__s + 0x878) & 0xfffffe00;
  *(uint *)((long)__s + 0x880) = *(uint *)((long)__s + 0x880) & 0xfffffe00;
  *(uint *)((long)__s + 0x888) = *(uint *)((long)__s + 0x888) & 0xfffffe00;
  *(uint *)((long)__s + 0x890) = *(uint *)((long)__s + 0x890) & 0xfffffe00;
  *(byte *)((long)__s + 0x894) = *(byte *)((long)__s + 0x894) | 3;
  *(uint *)((long)__s + 0x898) = *(uint *)((long)__s + 0x898) & 0xf000f000 | 0x900020;
  *(uint *)((long)__s + 0x89c) = *(uint *)((long)__s + 0x89c) & 0xfffff000 | 300;
  *(uint *)((long)__s + 0x8a0) = *(uint *)((long)__s + 0x8a0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8a4) = *(uint *)((long)__s + 0x8a4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8a8) = *(uint *)((long)__s + 0x8a8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8ac) = *(uint *)((long)__s + 0x8ac) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8b0) = (uint)*(byte *)((long)__s + 0x8b3) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x8b4) = (uint)*(byte *)((long)__s + 0x8b7) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x8b8) = (uint)*(byte *)((long)__s + 0x8bb) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x8bc) = (uint)*(byte *)((long)__s + 0x8bf) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x8c0) = *(uint *)((long)__s + 0x8c0) & 0xf000f000 | 0x40018;
  *(uint *)((long)__s + 0x8c4) = *(uint *)((long)__s + 0x8c4) & 0xf000f000 | 0x80006;
  *(uint *)((long)__s + 0x8c8) = *(uint *)((long)__s + 0x8c8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8cc) = *(uint *)((long)__s + 0x8cc) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8d0) = *(uint *)((long)__s + 0x8d0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8d4) = *(uint *)((long)__s + 0x8d4) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0x8d8) = 0xa0a0a10;
  *(uint *)((long)__s + 0x8dc) = (uint)*(byte *)((long)__s + 0x8df) << 0x18 | 0xf0e0e;
  *(uint *)((long)__s + 0x8e0) = (uint)*(byte *)((long)__s + 0x8e3) << 0x18 | 0x100f0f;
  *(uint *)((long)__s + 0x8e4) = (uint)*(byte *)((long)__s + 0x8e7) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x8e8) = *(uint *)((long)__s + 0x8e8) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x8ec) = *(uint *)((long)__s + 0x8ec) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x8f0) = *(uint *)((long)__s + 0x8f0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8f4) = *(uint *)((long)__s + 0x8f4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8f8) = *(uint *)((long)__s + 0x8f8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x8fc) = *(uint *)((long)__s + 0x8fc) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x900) = (uint)*(byte *)((long)__s + 0x903) << 0x18 | 0x19191a;
  *(uint *)((long)__s + 0x904) = (uint)*(byte *)((long)__s + 0x907) << 0x18 | 0x171819;
  *(uint *)((long)__s + 0x908) = (uint)*(byte *)((long)__s + 0x90b) << 0x18 | 0x121315;
  *(uint *)((long)__s + 0x90c) = (uint)*(byte *)((long)__s + 0x90f) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x910) = *(uint *)((long)__s + 0x910) & 0xf000f000 | 0x900020;
  *(uint *)((long)__s + 0x914) = *(uint *)((long)__s + 0x914) & 0xfffff000 | 300;
  *(uint *)((long)__s + 0x918) = *(uint *)((long)__s + 0x918) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x91c) = *(uint *)((long)__s + 0x91c) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x920) = *(uint *)((long)__s + 0x920) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x924) = *(uint *)((long)__s + 0x924) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x928) = (uint)*(byte *)((long)__s + 0x92b) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x92c) = (uint)*(byte *)((long)__s + 0x92f) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x930) = (uint)*(byte *)((long)__s + 0x933) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x934) = (uint)*(byte *)((long)__s + 0x937) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x938) = *(uint *)((long)__s + 0x938) & 0xf000f000 | 0x40018;
  *(uint *)((long)__s + 0x93c) = *(uint *)((long)__s + 0x93c) & 0xf000f000 | 0x80006;
  *(uint *)((long)__s + 0x940) = *(uint *)((long)__s + 0x940) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x944) = *(uint *)((long)__s + 0x944) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x948) = *(uint *)((long)__s + 0x948) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x94c) = *(uint *)((long)__s + 0x94c) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0x950) = 0xb0b0b12;
  *(uint *)((long)__s + 0x954) = (uint)*(byte *)((long)__s + 0x957) << 0x18 | 0xd0d0d;
  *(uint *)((long)__s + 0x958) = (uint)*(byte *)((long)__s + 0x95b) << 0x18 | 0xf0f0f;
  *(uint *)((long)__s + 0x95c) = (uint)*(byte *)((long)__s + 0x95f) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x960) = *(uint *)((long)__s + 0x960) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x964) = *(uint *)((long)__s + 0x964) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x968) = *(uint *)((long)__s + 0x968) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x96c) = *(uint *)((long)__s + 0x96c) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x970) = *(uint *)((long)__s + 0x970) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x974) = *(uint *)((long)__s + 0x974) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x978) = (uint)*(byte *)((long)__s + 0x97b) << 0x18 | 0x19191a;
  *(uint *)((long)__s + 0x97c) = (uint)*(byte *)((long)__s + 0x97f) << 0x18 | 0x171819;
  *(uint *)((long)__s + 0x980) = (uint)*(byte *)((long)__s + 0x983) << 0x18 | 0x121315;
  *(uint *)((long)__s + 0x984) = (uint)*(byte *)((long)__s + 0x987) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x988) = *(uint *)((long)__s + 0x988) & 0xf000f000 | 0x900020;
  *(uint *)((long)__s + 0x98c) = *(uint *)((long)__s + 0x98c) & 0xfffff000 | 300;
  *(uint *)((long)__s + 0x990) = *(uint *)((long)__s + 0x990) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x994) = *(uint *)((long)__s + 0x994) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x998) = *(uint *)((long)__s + 0x998) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x99c) = *(uint *)((long)__s + 0x99c) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9a0) = (uint)*(byte *)((long)__s + 0x9a3) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x9a4) = (uint)*(byte *)((long)__s + 0x9a7) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x9a8) = (uint)*(byte *)((long)__s + 0x9ab) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x9ac) = (uint)*(byte *)((long)__s + 0x9af) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x9b0) = *(uint *)((long)__s + 0x9b0) & 0xf000f000 | 0x180018;
  *(uint *)((long)__s + 0x9b4) = *(uint *)((long)__s + 0x9b4) & 0xf000f000 | 0x600030;
  *(uint *)((long)__s + 0x9b8) = *(uint *)((long)__s + 0x9b8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9bc) = *(uint *)((long)__s + 0x9bc) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9c0) = *(uint *)((long)__s + 0x9c0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9c4) = *(uint *)((long)__s + 0x9c4) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0x9c8) = 0x10101010;
  *(uint *)((long)__s + 0x9cc) = (uint)*(byte *)((long)__s + 0x9cf) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x9d0) = (uint)*(byte *)((long)__s + 0x9d3) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x9d4) = (uint)*(byte *)((long)__s + 0x9d7) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0x9d8) = *(uint *)((long)__s + 0x9d8) & 0xf000f000 | 0x300018;
  *(uint *)((long)__s + 0x9dc) = *(uint *)((long)__s + 0x9dc) & 0xfffff000 | 0x40;
  *(uint *)((long)__s + 0x9e0) = *(uint *)((long)__s + 0x9e0) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9e4) = *(uint *)((long)__s + 0x9e4) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9e8) = *(uint *)((long)__s + 0x9e8) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9ec) = *(uint *)((long)__s + 0x9ec) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0x9f0) = (uint)*(byte *)((long)__s + 0x9f3) << 0x18 | 0x19191a;
  *(uint *)((long)__s + 0x9f4) = (uint)*(byte *)((long)__s + 0x9f7) << 0x18 | 0x171819;
  *(uint *)((long)__s + 0x9f8) = (uint)*(byte *)((long)__s + 0x9fb) << 0x18 | 0x121315;
  *(uint *)((long)__s + 0x9fc) = (uint)*(byte *)((long)__s + 0x9ff) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa00) = *(uint *)((long)__s + 0xa00) & 0xf000f000 | 0x900020;
  *(uint *)((long)__s + 0xa04) = *(uint *)((long)__s + 0xa04) & 0xfffff000 | 300;
  *(uint *)((long)__s + 0xa08) = *(uint *)((long)__s + 0xa08) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa0c) = *(uint *)((long)__s + 0xa0c) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa10) = *(uint *)((long)__s + 0xa10) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa14) = *(uint *)((long)__s + 0xa14) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa18) = (uint)*(byte *)((long)__s + 0xa1b) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa1c) = (uint)*(byte *)((long)__s + 0xa1f) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa20) = (uint)*(byte *)((long)__s + 0xa23) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa24) = (uint)*(byte *)((long)__s + 0xa27) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa28) = *(uint *)((long)__s + 0xa28) & 0xf000f000 | 0x180018;
  *(uint *)((long)__s + 0xa2c) = *(uint *)((long)__s + 0xa2c) & 0xf000f000 | 0x600030;
  *(uint *)((long)__s + 0xa30) = *(uint *)((long)__s + 0xa30) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa34) = *(uint *)((long)__s + 0xa34) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa38) = *(uint *)((long)__s + 0xa38) & 0xf000f000 | 0x190001f;
  *(uint *)((long)__s + 0xa3c) = *(uint *)((long)__s + 0xa3c) & 0xf000f000 | 0x190001f;
  *(undefined4 *)((long)__s + 0xa40) = 0x10101010;
  *(uint *)((long)__s + 0xa44) = (uint)*(byte *)((long)__s + 0xa47) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa48) = (uint)*(byte *)((long)__s + 0xa4b) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa4c) = (uint)*(byte *)((long)__s + 0xa4f) << 0x18 | 0x101010;
  *(uint *)((long)__s + 0xa50) = *(uint *)((long)__s + 0xa50) & 0xf000f000 | 0x6000a0;
  *(uint *)((long)__s + 0xa54) = *(uint *)((long)__s + 0xa54) & 0xf000 | 0xb410001e;
  *(uint *)((long)__s + 0xa58) = *(uint *)((long)__s + 0xa58) & 0xf000f000 | 0x6000a0;
  *(uint *)((long)__s + 0xa5c) = *(uint *)((long)__s + 0xa5c) & 0xccccf000 | 0x3210001e;
  *(uint *)((long)__s + 0xa60) = (uint)*(byte *)((long)__s + 0xa63) << 0x18 | 0x61616;
  *(uint *)((long)__s + 0xa64) = *(uint *)((long)__s + 0xa64) & 0xf000f000 | 0x200040;
  *(uint *)((long)__s + 0xa68) = *(uint *)((long)__s + 0xa68) & 0xf000f000 | 0x400024;
  *(uint *)((long)__s + 0xa6c) = *(uint *)((long)__s + 0xa6c) & 0x1000f000 | 0xa0040009;
  *(uint *)((long)__s + 0xa70) = *(uint *)((long)__s + 0xa70) & 0xff00ff00 | 0x19001f;
  *(uint *)((long)__s + 0xa74) = *(uint *)((long)__s + 0xa74) & 0x1000f000 | 0xa0040009;
  *(uint *)((long)__s + 0xa78) = *(uint *)((long)__s + 0xa78) & 0xff00ff00 | 0x19001f;
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2b0)];
  uVar25 = (uint)bVar34 << 8;
  uVar28 = (uint)bVar34 << 0x10;
  uVar38 = (uint)bVar34;
  *(uint *)((long)__s + 0x8b0) =
       (uint)*(byte *)((long)__s + 0x8b3) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0x8b4) =
       (uint)*(byte *)((long)__s + 0x8b7) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0x8b8) =
       (uint)*(byte *)((long)__s + 0x8bb) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0x8bc) =
       (uint)*(byte *)((long)__s + 0x8bf) << 0x18 | uVar38 | uVar25 | uVar28;
  if (*(int *)(lVar27 + 0x2c0) != 0) {
    bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2c8)];
    uVar38 = 0x18;
    if (0x18 < bVar34) {
      uVar38 = (uint)bVar34;
    }
    uVar28 = (uint)bVar34;
    uVar25 = 4;
    if (uVar28 < 4) {
      uVar25 = uVar28;
    }
    uVar56 = 6;
    if (uVar28 < 6) {
      uVar56 = uVar28;
    }
    *(uint *)((long)__s + 0x8c0) =
         uVar25 << 0x10 | *(uint *)((long)__s + 0x8c0) & 0xf000f000 | uVar38;
    uVar25 = (uint)bVar34;
    uVar38 = 8;
    if (uVar25 < 8) {
      uVar38 = uVar25;
    }
    *(uint *)((long)__s + 0x8c4) =
         uVar38 << 0x10 | *(uint *)((long)__s + 0x8c4) & 0xf000f000 | uVar56;
    uVar38 = 10;
    if (uVar25 < 10) {
      uVar38 = uVar25;
    }
    *(uint *)((long)__s + 0x8d8) = uVar38 * 0x1010100 | uVar25;
    uVar38 = 0xe;
    if (uVar25 < 0xe) {
      uVar38 = uVar25;
    }
    uVar56 = (uint)bVar34;
    uVar28 = 0xf;
    if (uVar25 < 0xf) {
      uVar28 = uVar56;
    }
    *(uint *)((long)__s + 0x8dc) =
         uVar28 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x8df) << 0x18 | uVar38;
    *(uint *)((long)__s + 0x8e0) =
         uVar28 << 8 | (uint)*(byte *)((long)__s + 0x8e3) << 0x18 | uVar28 | uVar56 << 0x10;
    *(uint *)((long)__s + 0x8e4) =
         uVar56 << 8 | (uint)*(byte *)((long)__s + 0x8e7) << 0x18 | uVar56 | uVar56 << 0x10;
  }
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2a0)];
  uVar38 = 0x1a;
  if (0x1a < bVar34) {
    uVar38 = (uint)bVar34;
  }
  uVar28 = (uint)bVar34;
  uVar25 = 0x19;
  if (0x19 < uVar28) {
    uVar25 = uVar28;
  }
  *(uint *)((long)__s + 0x900) =
       uVar25 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x903) << 0x18 | uVar38;
  uVar38 = 0x18;
  if (0x18 < uVar28) {
    uVar38 = uVar28;
  }
  uVar56 = (uint)bVar34;
  uVar28 = 0x17;
  if (0x17 < uVar56) {
    uVar28 = uVar56;
  }
  *(uint *)((long)__s + 0x904) =
       uVar28 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x907) << 0x18 | uVar25;
  uVar38 = 0x15;
  if (0x15 < uVar56) {
    uVar38 = uVar56;
  }
  uVar25 = 0x13;
  if (0x13 < uVar56) {
    uVar25 = uVar56;
  }
  uVar28 = 0x12;
  if (0x12 < uVar56) {
    uVar28 = uVar56;
  }
  *(uint *)((long)__s + 0x908) =
       uVar28 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x90b) << 0x18 | uVar38;
  uVar38 = (uint)bVar34;
  *(uint *)((long)__s + 0x90c) =
       uVar38 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x90f) << 0x18 | uVar38;
  uVar25 = (uint)(byte)h265e_mode_bias[*(int *)(lVar27 + 0x2b4)];
  uVar38 = uVar25 << 8;
  uVar28 = (uint)(byte)h265e_mode_bias[*(int *)(lVar27 + 0x2b4)] << 0x10;
  *(uint *)((long)__s + 0x928) =
       (uint)*(byte *)((long)__s + 0x92b) << 0x18 | uVar25 | uVar38 | uVar28;
  *(uint *)((long)__s + 0x92c) =
       (uint)*(byte *)((long)__s + 0x92f) << 0x18 | uVar25 | uVar38 | uVar28;
  *(uint *)((long)__s + 0x930) =
       (uint)*(byte *)((long)__s + 0x933) << 0x18 | uVar25 | uVar38 | uVar28;
  *(uint *)((long)__s + 0x934) =
       (uint)*(byte *)((long)__s + 0x937) << 0x18 | uVar25 | uVar38 | uVar28;
  if (*(int *)(lVar27 + 0x2c0) != 0) {
    bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2c8)];
    uVar38 = *(uint *)(lVar27 + 0x2c4) & 0xfff;
    if (0x17 < (int)*(uint *)(lVar27 + 0x2c4)) {
      uVar38 = 0x18;
    }
    uVar25 = *(uint *)((long)__s + 0x938);
    *(uint *)((long)__s + 0x938) = uVar25 & 0xfffff000 | uVar38;
    uVar28 = 0x40000;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 4) {
      uVar28 = (*(uint *)(lVar27 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x938) = uVar25 & 0xf000f000 | uVar38 | uVar28;
    uVar38 = 6;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 6) {
      uVar38 = *(uint *)(lVar27 + 0x2c4) & 0xfff;
    }
    uVar25 = *(uint *)((long)__s + 0x93c);
    *(uint *)((long)__s + 0x93c) = uVar25 & 0xfffff000 | uVar38;
    uVar28 = 0x12;
    if (0x12 < bVar34) {
      uVar28 = (uint)bVar34;
    }
    uVar43 = (uint)bVar34;
    uVar56 = 0xb;
    if (uVar43 < 0xb) {
      uVar56 = uVar43;
    }
    *(uint *)((long)__s + 0x93c) =
         uVar25 & 0xf000f000 | uVar38 | (*(uint *)(lVar27 + 0x2c4) & 0xfff) << 0x10;
    *(uint *)((long)__s + 0x950) = uVar56 << 0x18 | uVar56 << 0x10 | uVar56 << 8 | uVar28;
    uVar38 = 0xd;
    if (uVar43 < 0xd) {
      uVar38 = uVar43;
    }
    *(uint *)((long)__s + 0x954) =
         uVar38 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x957) << 0x18 | uVar38;
    uVar25 = (uint)bVar34;
    uVar38 = 0xf;
    if (uVar25 < 0xf) {
      uVar38 = uVar25;
    }
    *(uint *)((long)__s + 0x958) =
         uVar38 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x95b) << 0x18 | uVar38;
    *(uint *)((long)__s + 0x95c) =
         uVar25 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x95f) << 0x18 | uVar25;
  }
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2a4)];
  uVar38 = 0x1a;
  if (0x1a < bVar34) {
    uVar38 = (uint)bVar34;
  }
  uVar28 = (uint)bVar34;
  uVar25 = 0x19;
  if (0x19 < uVar28) {
    uVar25 = uVar28;
  }
  *(uint *)((long)__s + 0x978) =
       uVar25 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x97b) << 0x18 | uVar38;
  uVar38 = 0x18;
  if (0x18 < uVar28) {
    uVar38 = uVar28;
  }
  uVar56 = (uint)bVar34;
  uVar28 = 0x17;
  if (0x17 < uVar56) {
    uVar28 = uVar56;
  }
  *(uint *)((long)__s + 0x97c) =
       uVar28 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x97f) << 0x18 | uVar25;
  uVar38 = 0x15;
  if (0x15 < uVar56) {
    uVar38 = uVar56;
  }
  uVar25 = 0x13;
  if (0x13 < uVar56) {
    uVar25 = uVar56;
  }
  uVar28 = 0x12;
  if (0x12 < uVar56) {
    uVar28 = uVar56;
  }
  *(uint *)((long)__s + 0x980) =
       uVar28 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x983) << 0x18 | uVar38;
  *(uint *)((long)__s + 0x984) =
       (uint)bVar34 << 0x10 | (uint)bVar34 << 8 | (uint)*(byte *)((long)__s + 0x987) << 0x18 |
       (uint)bVar34;
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2b8)];
  uVar25 = (uint)bVar34 << 8;
  uVar28 = (uint)bVar34 << 0x10;
  uVar38 = (uint)bVar34;
  *(uint *)((long)__s + 0x9a0) =
       (uint)*(byte *)((long)__s + 0x9a3) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0x9a4) =
       (uint)*(byte *)((long)__s + 0x9a7) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0x9a8) =
       (uint)*(byte *)((long)__s + 0x9ab) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0x9ac) =
       (uint)*(byte *)((long)__s + 0x9af) << 0x18 | uVar38 | uVar25 | uVar28;
  if (*(int *)(lVar27 + 0x2c0) != 0) {
    bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2c8)];
    uVar38 = 0x18;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 0x18) {
      uVar38 = *(uint *)(lVar27 + 0x2c4) & 0xfff;
    }
    uVar25 = *(uint *)((long)__s + 0x9b0);
    *(uint *)((long)__s + 0x9b0) = uVar25 & 0xfffff000 | uVar38;
    uVar28 = 0x180000;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 0x18) {
      uVar28 = (*(uint *)(lVar27 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0x9b0) = uVar25 & 0xf000f000 | uVar38 | uVar28;
    uVar38 = 0x30;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 0x30) {
      uVar38 = *(uint *)(lVar27 + 0x2c4) & 0xfff;
    }
    uVar25 = *(uint *)((long)__s + 0x9b4);
    *(uint *)((long)__s + 0x9b4) = uVar25 & 0xfffff000 | uVar38;
    *(uint *)((long)__s + 0x9b4) =
         uVar25 & 0xf000f000 | uVar38 | (*(uint *)(lVar27 + 0x2c4) & 0xfff) << 0x10;
    uVar25 = (uint)bVar34 << 8;
    uVar28 = (uint)bVar34 << 0x10;
    uVar38 = (uint)bVar34;
    *(uint *)((long)__s + 0x9c8) = uVar38 * 0x1010101;
    *(uint *)((long)__s + 0x9cc) =
         (uint)*(byte *)((long)__s + 0x9cf) << 0x18 | uVar38 | uVar25 | uVar28;
    *(uint *)((long)__s + 0x9d0) =
         (uint)*(byte *)((long)__s + 0x9d3) << 0x18 | uVar38 | uVar25 | uVar28;
    *(uint *)((long)__s + 0x9d4) =
         (uint)*(byte *)((long)__s + 0x9d7) << 0x18 | uVar38 | uVar25 | uVar28;
  }
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 0x2a8)];
  uVar38 = 0x1a;
  if (0x1a < bVar34) {
    uVar38 = (uint)bVar34;
  }
  uVar28 = (uint)bVar34;
  uVar25 = 0x19;
  if (0x19 < uVar28) {
    uVar25 = uVar28;
  }
  *(uint *)((long)__s + 0x9f0) =
       uVar25 << 0x10 | uVar25 << 8 | (uint)*(byte *)((long)__s + 0x9f3) << 0x18 | uVar38;
  uVar38 = 0x18;
  if (0x18 < uVar28) {
    uVar38 = uVar28;
  }
  uVar56 = (uint)bVar34;
  uVar28 = 0x17;
  if (0x17 < uVar56) {
    uVar28 = uVar56;
  }
  uVar43 = 0x15;
  if (0x15 < uVar56) {
    uVar43 = uVar56;
  }
  *(uint *)((long)__s + 0x9f4) =
       uVar28 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x9f7) << 0x18 | uVar25;
  uVar38 = 0x13;
  if (0x13 < uVar56) {
    uVar38 = uVar56;
  }
  uVar25 = 0x12;
  if (0x12 < uVar56) {
    uVar25 = uVar56;
  }
  *(uint *)((long)__s + 0x9f8) =
       uVar25 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x9fb) << 0x18 | uVar43;
  uVar38 = (uint)bVar34;
  *(uint *)((long)__s + 0x9fc) =
       uVar38 << 0x10 | uVar38 << 8 | (uint)*(byte *)((long)__s + 0x9ff) << 0x18 | uVar38;
  bVar34 = (byte)h265e_mode_bias[*(int *)(lVar27 + 700)];
  uVar25 = (uint)bVar34 << 8;
  uVar28 = (uint)bVar34 << 0x10;
  uVar38 = (uint)bVar34;
  *(uint *)((long)__s + 0xa18) =
       (uint)*(byte *)((long)__s + 0xa1b) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0xa1c) =
       (uint)*(byte *)((long)__s + 0xa1f) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0xa20) =
       (uint)*(byte *)((long)__s + 0xa23) << 0x18 | uVar38 | uVar25 | uVar28;
  *(uint *)((long)__s + 0xa24) =
       (uint)*(byte *)((long)__s + 0xa27) << 0x18 | uVar38 | uVar25 | uVar28;
  if (*(int *)(lVar27 + 0x2c0) != 0) {
    RVar17 = h265e_mode_bias[*(int *)(lVar27 + 0x2c8)];
    uVar25 = (uint)(byte)RVar17;
    uVar38 = 0x18;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 0x18) {
      uVar38 = *(uint *)(lVar27 + 0x2c4) & 0xfff;
    }
    uVar28 = *(uint *)((long)__s + 0xa28);
    *(uint *)((long)__s + 0xa28) = uVar28 & 0xfffff000 | uVar38;
    uVar56 = 0x180000;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 0x18) {
      uVar56 = (*(uint *)(lVar27 + 0x2c4) & 0xfff) << 0x10;
    }
    *(uint *)((long)__s + 0xa28) = uVar28 & 0xf000f000 | uVar38 | uVar56;
    uVar38 = 0x30;
    if ((int)*(uint *)(lVar27 + 0x2c4) < 0x30) {
      uVar38 = *(uint *)(lVar27 + 0x2c4) & 0xfff;
    }
    uVar28 = *(uint *)((long)__s + 0xa2c);
    *(uint *)((long)__s + 0xa2c) = uVar28 & 0xfffff000 | uVar38;
    *(uint *)((long)__s + 0xa2c) =
         uVar28 & 0xf000f000 | uVar38 | (*(uint *)(lVar27 + 0x2c4) & 0xfff) << 0x10;
    uVar38 = uVar25 << 8;
    uVar28 = (uint)(byte)RVar17 << 0x10;
    *(uint *)((long)__s + 0xa40) = uVar25 * 0x1010101;
    *(uint *)((long)__s + 0xa44) =
         (uint)*(byte *)((long)__s + 0xa47) << 0x18 | uVar25 | uVar38 | uVar28;
    *(uint *)((long)__s + 0xa48) =
         (uint)*(byte *)((long)__s + 0xa4b) << 0x18 | uVar25 | uVar38 | uVar28;
    *(uint *)((long)__s + 0xa4c) =
         (uint)*(byte *)((long)__s + 0xa4f) << 0x18 | uVar25 | uVar38 | uVar28;
  }
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","enter\n","vepu580_h265_scl_cfg");
  }
  memcpy((void *)((long)__s + 0xa94),vepu580_h265_scl_cfg_vepu580_h265_scl_tab,0xa98);
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave\n","vepu580_h265_scl_cfg");
  }
  memcpy((void *)((long)__s + 0x3bc),lamd_satd_qp,0xd0);
  if (*(int *)((long)hal + 0xb0) == 2) {
    lVar24 = 0;
    do {
      *(undefined1 *)((long)__s + lVar24 + 0x21c) = *(undefined1 *)(lVar27 + 0x198 + lVar24 * 4);
      *(byte *)((long)__s + lVar24 + 0x22c) = *(byte *)(lVar27 + 0x218 + lVar24 * 4) & 0x3f;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x10);
    pRVar40 = lamd_moda_qp;
  }
  else {
    lVar24 = 0;
    do {
      *(undefined1 *)((long)__s + lVar24 + 0x21c) = *(undefined1 *)(lVar27 + 0x1d8 + lVar24 * 4);
      *(byte *)((long)__s + lVar24 + 0x22c) = *(byte *)(lVar27 + 600 + lVar24 * 4) & 0x3f;
      lVar24 = lVar24 + 1;
    } while (lVar24 != 0x10);
    pRVar40 = lamd_modb_qp;
  }
  memcpy((void *)((long)__s + 0x4bc),pRVar40,0xd0);
  *(uint *)((long)__s + 0x218) = *(uint *)((long)__s + 0x218) & 0xff00fffe | 0x190000;
  *(uint *)((long)__s + 0x248) = (uint)*(byte *)((long)__s + 0x24b) << 0x18 | 0x281e14;
  *(uint *)((long)__s + 0x24c) = (uint)*(byte *)((long)__s + 0x24f) << 0x18 | 0x2d2319;
  *(uint *)((long)__s + 0x2ec) = *(uint *)((long)__s + 0x2ec) & 0xfff00000 | 0x154ab;
  *(undefined8 *)((long)__s + 700) = 0x24001000060002;
  *(undefined8 *)((long)__s + 0x2c4) = 0x24001000060002;
  *(undefined8 *)((long)__s + 0x2d8) = 0x1a181614151617;
  *(undefined8 *)((long)__s + 0x2e0) = 0x12121112111111;
  *(uint *)((long)__s + 0x31c) = *(uint *)((long)__s + 0x31c) & 0xfffffcf8 | 0x304;
  *(uint *)((long)__s + 800) = *(uint *)((long)__s + 800) & 0xe0080200 | 0x8014020;
  *(uint *)((long)__s + 0x324) = *(uint *)((long)__s + 0x324) & 0xfc00fc00 | 0x200010;
  *(uint *)((long)__s + 0x328) = *(uint *)((long)__s + 0x328) & 0xfc00fc00 | 0x600060;
  *(uint *)((long)__s + 0x32c) = *(uint *)((long)__s + 0x32c) & 0xf0f0f000 | 0x8030030;
  *(uint *)((long)__s + 0x330) = *(uint *)((long)__s + 0x330) & 0xc0000000 | 0x8004010;
  *(uint *)((long)__s + 0x334) = *(uint *)((long)__s + 0x334) & 0xf000f000 | 0x100010;
  *(uint *)((long)__s + 0x338) = *(uint *)((long)__s + 0x338) & 0xfff0f000 | 0x10010;
  plVar13 = *(long **)((long)hal + 0x150);
  if (plVar13 != (long *)0x0) {
    lVar27 = *plVar13;
    lVar24 = *(long *)(lVar27 + 200);
    uVar38 = (uint)(*(int *)(lVar24 + 0x1864) != 1);
    *(uint *)((long)plVar13 + 0xc) = uVar38;
    uVar38 = uVar38 * 2 + (int)plVar13[1];
    if (uVar38 < 4) {
      lVar12 = *(long *)(*(long *)(lVar27 + 0x80) + 0x18);
      iVar37 = *(int *)(lVar24 + 0x1894);
      uVar41 = 3;
      if (iVar37 == 0) {
        uVar41 = (ulong)uVar38;
      }
      aRVar14 = lvl32_preintra_cst_wgt[uVar41];
      *(RK_U8 (*) [8])(lVar12 + 0x2d8) = aRVar14;
      *(RK_U8 (*) [8])(lVar12 + 0x2e0) = aRVar14;
      if (*(int *)(lVar24 + 0x2c0) == 0) {
        lVar15 = *(long *)(*(long *)(lVar27 + 0x80) + 0x18);
        uVar41 = 3;
        if (*(int *)(*(long *)(lVar27 + 200) + 0x1894) == 0) {
          uVar41 = (ulong)uVar38;
        }
        *(uint *)(lVar15 + 0x8c0) = *(uint *)(lVar15 + 0x8c0) & 0xf000f000 | 0x20001;
        *(uint *)(lVar15 + 0x8c4) = *(uint *)(lVar15 + 0x8c4) & 0xf000f000 | 0x60004;
        *(uint *)(lVar15 + 0x8d8) =
             (skip_b64_atf_wgt[uVar41][2] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar41][1] & 0xffU) << 8 | (uint)(byte)skip_b64_atf_wgt[uVar41][0] |
             skip_b64_atf_wgt[uVar41][3] << 0x18;
        *(uint *)(lVar15 + 0x8dc) =
             (skip_b64_atf_wgt[uVar41][6] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar41][5] & 0xffU) << 8 |
             (uint)*(byte *)(lVar15 + 0x8df) << 0x18 | (uint)(byte)skip_b64_atf_wgt[uVar41][4];
        *(uint *)(lVar15 + 0x8e0) =
             (skip_b64_atf_wgt[uVar41][9] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar41][8] & 0xffU) << 8 |
             (uint)*(byte *)(lVar15 + 0x8e3) << 0x18 | (uint)(byte)skip_b64_atf_wgt[uVar41][7];
        *(uint *)(lVar15 + 0x8e4) =
             (skip_b64_atf_wgt[uVar41][0xc] & 0xffU) << 0x10 |
             (skip_b64_atf_wgt[uVar41][0xb] & 0xffU) << 8 |
             (uint)*(byte *)(lVar15 + 0x8e7) << 0x18 | (uint)(byte)skip_b64_atf_wgt[uVar41][10];
        *(uint *)(lVar15 + 0x8e8) = *(uint *)(lVar15 + 0x8e8) & 0xf000f000 | 0x300018;
        *(uint *)(lVar15 + 0x8ec) = *(uint *)(lVar15 + 0x8ec) & 0xfffff000 | 0x40;
        uVar48 = (uint)(byte)intra_b32_atf_wgt[uVar41][0];
        uVar43 = (intra_b32_atf_wgt[uVar41][1] & 0xffU) * 0x100;
        uVar49 = (intra_b32_atf_wgt[uVar41][2] & 0xffU) * 0x10000;
        *(uint *)(lVar15 + 0x900) =
             (uint)*(byte *)(lVar15 + 0x903) << 0x18 | uVar48 | uVar43 | uVar49;
        uVar51 = (uint)(byte)intra_b32_atf_wgt[uVar41][3];
        uVar36 = (intra_b32_atf_wgt[uVar41][4] & 0xffU) * 0x100;
        uVar18 = (intra_b32_atf_wgt[uVar41][5] & 0xffU) * 0x10000;
        *(uint *)(lVar15 + 0x904) =
             (uint)*(byte *)(lVar15 + 0x907) << 0x18 | uVar51 | uVar36 | uVar18;
        uVar19 = (uint)(byte)intra_b32_atf_wgt[uVar41][6];
        uVar26 = (intra_b32_atf_wgt[uVar41][7] & 0xffU) * 0x100;
        uVar53 = (intra_b32_atf_wgt[uVar41][8] & 0xffU) * 0x10000;
        *(uint *)(lVar15 + 0x908) =
             (uint)*(byte *)(lVar15 + 0x90b) << 0x18 | uVar19 | uVar26 | uVar53;
        bVar34 = (byte)intra_b32_atf_wgt[uVar41][9];
        uVar44 = (intra_b32_atf_wgt[uVar41][10] & 0xffU) * 0x100;
        uVar25 = (intra_b32_atf_wgt[uVar41][0xb] & 0xffU) * 0x10000;
        *(uint *)(lVar15 + 0x90c) =
             (uint)*(byte *)(lVar15 + 0x90f) << 0x18 | (uint)bVar34 | uVar44 | uVar25;
        *(uint *)(lVar15 + 0x938) = *(uint *)(lVar15 + 0x938) & 0xf000f000 | 0x20001;
        *(uint *)(lVar15 + 0x93c) = *(uint *)(lVar15 + 0x93c) & 0xf000f000 | 0x60004;
        *(uint *)(lVar15 + 0x950) =
             (skip_b32_atf_wgt[uVar41][2] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar41][1] & 0xffU) << 8 | (uint)(byte)skip_b32_atf_wgt[uVar41][0] |
             skip_b32_atf_wgt[uVar41][3] << 0x18;
        *(uint *)(lVar15 + 0x954) =
             (skip_b32_atf_wgt[uVar41][6] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar41][5] & 0xffU) << 8 |
             (uint)*(byte *)(lVar15 + 0x957) << 0x18 | (uint)(byte)skip_b32_atf_wgt[uVar41][4];
        *(uint *)(lVar15 + 0x958) =
             (skip_b32_atf_wgt[uVar41][9] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar41][8] & 0xffU) << 8 |
             (uint)*(byte *)(lVar15 + 0x95b) << 0x18 | (uint)(byte)skip_b32_atf_wgt[uVar41][7];
        *(uint *)(lVar15 + 0x95c) =
             (skip_b32_atf_wgt[uVar41][0xc] & 0xffU) << 0x10 |
             (skip_b32_atf_wgt[uVar41][0xb] & 0xffU) << 8 |
             (uint)*(byte *)(lVar15 + 0x95f) << 0x18 | (uint)(byte)skip_b32_atf_wgt[uVar41][10];
        *(uint *)(lVar15 + 0x960) = *(uint *)(lVar15 + 0x960) & 0xf000f000 | 0x300018;
        *(uint *)(lVar15 + 0x964) = *(uint *)(lVar15 + 0x964) & 0xfffff000 | 0x40;
        *(uint *)(lVar15 + 0x978) =
             (uint)*(byte *)(lVar15 + 0x97b) * 0x1000000 + uVar48 + uVar43 + uVar49;
        *(uint *)(lVar15 + 0x97c) =
             (uint)*(byte *)(lVar15 + 0x97f) * 0x1000000 + uVar51 + uVar36 + uVar18;
        *(uint *)(lVar15 + 0x980) =
             (uint)*(byte *)(lVar15 + 0x983) * 0x1000000 + uVar19 + uVar26 + uVar53;
        *(uint *)(lVar15 + 0x984) =
             ((uint)*(byte *)(lVar15 + 0x987) << 0x18 | (uint)bVar34 | uVar44) + uVar25;
        *(uint *)(lVar15 + 0x9b0) = *(uint *)(lVar15 + 0x9b0) & 0xf000f000 | 0x20001;
        *(uint *)(lVar15 + 0x9b4) = *(uint *)(lVar15 + 0x9b4) & 0xf000f000 | 0x60004;
        uVar57 = skip_b16_atf_wgt[uVar41][3] << 0x18 |
                 (skip_b16_atf_wgt[uVar41][2] & 0xffU) << 0x10 |
                 (skip_b16_atf_wgt[uVar41][1] & 0xffU) << 8 |
                 (uint)(byte)skip_b16_atf_wgt[uVar41][0];
        *(uint *)(lVar15 + 0x9c8) = uVar57;
        uVar39 = (uint)(byte)skip_b16_atf_wgt[uVar41][4];
        uVar55 = (skip_b16_atf_wgt[uVar41][5] & 0xffU) << 8;
        uVar30 = (skip_b16_atf_wgt[uVar41][6] & 0xffU) << 0x10;
        *(uint *)(lVar15 + 0x9cc) =
             (uint)*(byte *)(lVar15 + 0x9cf) << 0x18 | uVar39 | uVar55 | uVar30;
        uVar31 = (uint)(byte)skip_b16_atf_wgt[uVar41][7];
        uVar47 = (skip_b16_atf_wgt[uVar41][8] & 0xffU) << 8;
        uVar45 = (skip_b16_atf_wgt[uVar41][9] & 0xffU) << 0x10;
        *(uint *)(lVar15 + 0x9d0) =
             (uint)*(byte *)(lVar15 + 0x9d3) << 0x18 | uVar31 | uVar47 | uVar45;
        uVar28 = (skip_b16_atf_wgt[uVar41][0xb] & 0xffU) << 8;
        uVar52 = (uint)(byte)skip_b16_atf_wgt[uVar41][10];
        uVar56 = (skip_b16_atf_wgt[uVar41][0xc] & 0xffU) << 0x10;
        *(uint *)(lVar15 + 0x9d4) =
             (uint)*(byte *)(lVar15 + 0x9d7) << 0x18 | uVar52 | uVar28 | uVar56;
        *(uint *)(lVar15 + 0x9d8) = *(uint *)(lVar15 + 0x9d8) & 0xf000f000 | 0x300018;
        *(uint *)(lVar15 + 0x9dc) = *(uint *)(lVar15 + 0x9dc) & 0xfffff000 | 0x40;
        *(uint *)(lVar15 + 0x9f0) =
             (uint)*(byte *)(lVar15 + 0x9f3) * 0x1000000 + uVar48 + uVar43 + uVar49;
        *(uint *)(lVar15 + 0x9f4) =
             (uint)*(byte *)(lVar15 + 0x9f7) * 0x1000000 + uVar51 + uVar36 + uVar18;
        *(uint *)(lVar15 + 0x9f8) =
             (uint)*(byte *)(lVar15 + 0x9fb) * 0x1000000 + uVar19 + uVar26 + uVar53;
        *(uint *)(lVar15 + 0x9fc) =
             (uint)*(byte *)(lVar15 + 0x9ff) * 0x1000000 + (uint)bVar34 + uVar44 + uVar25;
        *(uint *)(lVar15 + 0xa28) = *(uint *)(lVar15 + 0xa28) & 0xf000f000 | 0x20001;
        *(uint *)(lVar15 + 0xa2c) = *(uint *)(lVar15 + 0xa2c) & 0xf000f000 | 0x60004;
        *(uint *)(lVar15 + 0xa40) = uVar57;
        *(uint *)(lVar15 + 0xa44) =
             (uint)*(byte *)(lVar15 + 0xa47) * 0x1000000 + uVar39 | uVar55 | uVar30;
        *(uint *)(lVar15 + 0xa48) =
             (uint)*(byte *)(lVar15 + 0xa4b) * 0x1000000 + uVar31 | uVar47 | uVar45;
        *(uint *)(lVar15 + 0xa4c) =
             (uint)*(byte *)(lVar15 + 0xa4f) * 0x1000000 + uVar52 | uVar28 | uVar56;
      }
      uVar28 = (uint)(byte)pre_intra_b32_cost[uVar38][0];
      uVar25 = (pre_intra_b32_cost[uVar38][1] & 0xffU) << 0x10;
      *(uint *)(lVar12 + 0xa70) = *(uint *)(lVar12 + 0xa70) & 0xff00ff00 | uVar28 | uVar25;
      *(uint *)(lVar12 + 0xa78) = *(uint *)(lVar12 + 0xa78) & 0xff00ff00 | uVar28 | uVar25;
      *(uint *)(lVar12 + 0x248) = (uint)*(byte *)(lVar12 + 0x24b) << 0x18 | 0x190f07;
      *(uint *)(lVar12 + 0x24c) = (uint)*(byte *)(lVar12 + 0x24f) << 0x18 | 0xf0904;
      *(uint *)(lVar12 + 0x31c) =
           (*(uint *)(lVar12 + 0x31c) & 0xfffffffb) + (uint)((int)plVar13[1] == 0) * 4;
      uVar25 = cime_multi[uVar38][3];
      *(uint *)(lVar12 + 0x324) =
           (cime_multi[uVar38][1] & 0x3ffU) << 0x10 |
           *(uint *)(lVar12 + 0x324) & 0xfc00fc00 | cime_multi[uVar38][0] & 0x3ffU;
      *(uint *)(lVar12 + 0x328) =
           (uVar25 & 0x3ff) << 0x10 |
           *(uint *)(lVar12 + 0x328) & 0xfc00fc00 | cime_multi[uVar38][2] & 0x3ffU;
      *(uint *)(lVar12 + 0x330) =
           (rime_multi[uVar38][2] & 0x3ffU) << 0x14 |
           *(uint *)(lVar12 + 0x330) & 0xc0000000 | (ushort)rime_multi[uVar38][0] & 0xc00003ff |
           (rime_multi[uVar38][1] & 0x3ffU) << 10;
      if ((int)plVar13[1] != 0) {
        *(uint *)(lVar12 + 0x338) = *(uint *)(lVar12 + 0x338) & 0xfff0ffff | 0x80000;
      }
      if (iVar37 == 0) {
        *(uint *)(lVar12 + 0x894) =
             *(uint *)(lVar12 + 0x894) & 0xfffffffe | (uint)((int)plVar13[1] == 0);
        uVar25 = (uint)((int)plVar13[1] == 0) * 2;
      }
      else {
        *(byte *)(lVar12 + 0x894) = *(byte *)(lVar12 + 0x894) & 0xfe;
        uVar25 = 0;
      }
      *(uint *)(lVar12 + 0x894) = *(uint *)(lVar12 + 0x894) & 0xfffffffd | uVar25;
      *(RK_U32 *)(lVar12 + 0x7c0) =
           (intra_lvl16_sobel_a[uVar38][4] & 0x3f) << 0x18 |
           (intra_lvl16_sobel_a[uVar38][3] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_a[uVar38][2] & 0x3f) << 0xc |
           *(uint *)(lVar12 + 0x7c0) & 0xc0000000 |
           (byte)intra_lvl16_sobel_a[uVar38][0] & 0xc000003f |
           (intra_lvl16_sobel_a[uVar38][1] & 0x3f) << 6;
      *(RK_U32 *)(lVar12 + 0x7c4) =
           (intra_lvl16_sobel_a[uVar38][8] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_a[uVar38][7] & 0x3f) << 0xc |
           (uint)*(byte *)(lVar12 + 0x7c7) << 0x18 |
           (byte)intra_lvl16_sobel_a[uVar38][5] & 0xff00003f |
           (intra_lvl16_sobel_a[uVar38][6] & 0x3f) << 6;
      *(RK_U32 *)(lVar12 + 0x7dc) =
           (intra_lvl16_sobel_c[uVar38][4] & 0x3f) << 0x18 |
           (intra_lvl16_sobel_c[uVar38][3] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_c[uVar38][2] & 0x3f) << 0xc |
           *(uint *)(lVar12 + 0x7dc) & 0xc0000000 |
           (byte)intra_lvl16_sobel_c[uVar38][0] & 0xc000003f |
           (intra_lvl16_sobel_c[uVar38][1] & 0x3f) << 6;
      *(RK_U32 *)(lVar12 + 0x7e0) =
           (intra_lvl16_sobel_c[uVar38][8] & 0x3f) << 0x12 |
           (intra_lvl16_sobel_c[uVar38][7] & 0x3f) << 0xc |
           (uint)*(byte *)(lVar12 + 0x7e3) << 0x18 |
           (byte)intra_lvl16_sobel_c[uVar38][5] & 0xff00003f |
           (intra_lvl16_sobel_c[uVar38][6] & 0x3f) << 6;
      uVar25 = intra_lvl16_sobel_d[uVar38][3];
      *(RK_U32 *)(lVar12 + 0x7e4) =
           (intra_lvl16_sobel_d[uVar38][1] & 0x7fff) << 0x10 |
           *(uint *)(lVar12 + 0x7e4) & 0x80008000 | intra_lvl16_sobel_d[uVar38][0] & 0x7fff;
      *(uint *)(lVar12 + 0x7e8) =
           (uVar25 & 0x7fff) << 0x10 |
           *(uint *)(lVar12 + 0x7e8) & 0x80008000 | intra_lvl16_sobel_d[uVar38][2] & 0x7fff;
      *(RK_U32 *)(lVar12 + 0x7ec) =
           (intra_lvl16_sobel_d[uVar38][5] & 0x7fff) << 0x10 |
           *(uint *)(lVar12 + 0x7ec) & 0x80008000 | intra_lvl16_sobel_d[uVar38][4] & 0x7fff;
      *(RK_U32 *)(lVar12 + 0x7f0) =
           (intra_lvl16_sobel_d[uVar38][7] & 0x7fff) << 0x10 |
           *(uint *)(lVar12 + 0x7f0) & 0x80008000 | intra_lvl16_sobel_d[uVar38][6] & 0x7fff;
      *(uint *)(lVar12 + 0x7f4) =
           *(uint *)(lVar12 + 0x7f4) & 0xffff8000 | intra_lvl16_sobel_d[uVar38][8] & 0x7fff;
      *(RK_U32 *)(lVar12 + 0x84c) =
           (intra_lvl32_sobel_a[uVar38][4] & 0x3f) << 0x18 |
           (intra_lvl32_sobel_a[uVar38][3] & 0x3f) << 0x12 |
           (intra_lvl32_sobel_a[uVar38][2] & 0x3f) << 0xc |
           *(uint *)(lVar12 + 0x84c) & 0xc0000000 |
           (byte)intra_lvl32_sobel_a[uVar38][0] & 0xc000003f |
           (intra_lvl32_sobel_a[uVar38][1] & 0x3f) << 6;
      *(RK_U32 *)(lVar12 + 0x85c) =
           (intra_lvl32_sobel_c[uVar38][4] & 0x3f) << 0x18 |
           (intra_lvl32_sobel_c[uVar38][3] & 0x3f) << 0x12 |
           (intra_lvl32_sobel_c[uVar38][2] & 0x3f) << 0xc |
           *(uint *)(lVar12 + 0x85c) & 0xc0000000 |
           (byte)intra_lvl32_sobel_c[uVar38][0] & 0xc000003f |
           (intra_lvl32_sobel_c[uVar38][1] & 0x3f) << 6;
      if (*(int *)(lVar24 + 0x18c) == 0) {
        uVar25 = *(uint *)(lVar12 + 0x2ec) & 0xfffffc00 | qnt_bias_i[uVar38] & 0x3ff;
        *(uint *)(lVar12 + 0x2ec) = uVar25;
        uVar28 = (qnt_bias_p[uVar38] & 0x3ff) << 10;
      }
      else {
        uVar25 = 0xab;
        if (*(uint *)(lVar24 + 0x184) != 0) {
          uVar25 = *(uint *)(lVar24 + 0x184) & 0x3ff;
        }
        uVar25 = *(uint *)(lVar12 + 0x2ec) & 0xfffffc00 | uVar25;
        *(uint *)(lVar12 + 0x2ec) = uVar25;
        uVar28 = 0x15400;
        if (*(uint *)(lVar24 + 0x188) != 0) {
          uVar28 = (*(uint *)(lVar24 + 0x188) & 0x3ff) << 10;
        }
      }
      *(uint *)(lVar12 + 0x2ec) = uVar25 & 0xfff003ff | uVar28;
      *(uint *)(lVar12 + 0x32c) =
           *(uint *)(lVar12 + 0x32c) & 0xfffff000 | rime_sqi_cime_sad_th[uVar38] & 0xfff;
      uVar25 = fme_sqi_cime_sad_pu16_th[uVar38] & 0xfff;
      *(RK_U32 *)(lVar12 + 0x334) =
           (fme_sqi_cime_sad_pu16_th[uVar38] & 0xfff) << 0x10 |
           *(uint *)(lVar12 + 0x334) & 0xf000f000 | uVar25;
      *(uint *)(lVar12 + 0x338) = *(uint *)(lVar12 + 0x338) & 0xfffff000 | uVar25;
      *(uint *)(lVar12 + 600) = *(uint *)(lVar12 + 600) & 0xfffffff8 | chrm_klut_ofst[uVar38] & 7;
    }
    else {
      _mpp_log_l(2,"hal_h265e_v580","scene_motion_flag is a wrong value %d\n",
                 "vepu580_h265e_tune_reg_patch");
    }
  }
  uVar5 = *(undefined4 *)(lVar7 + 0x28);
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","enter\n","vepu580_setup_split");
  }
  iVar37 = *(int *)(lVar9 + 0xe94);
  if (iVar37 == 2) {
    iVar37 = *(int *)(lVar9 + 0xc);
    iVar42 = *(int *)(lVar9 + 0x10);
    uVar38 = *(uint *)(lVar9 + 0xe98);
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48003;
    *(uint *)((long)__s + 0x148) =
         *(uint *)((long)__s + 0x148) & 0xfff00000 | *(int *)(lVar9 + 0xe98) - 1U & 0xfffff;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    iVar29 = *(int *)(lVar9 + 0xe9c);
    *(uint *)((long)__s + 0xe0) =
         *(uint *)((long)__s + 0xe0) & 0xbfffffff | (uint)(iVar29 != 0) << 0x1e;
    if (((*(byte *)(lVar9 + 0xe9c) & 1) != 0) ||
       ((bVar34 = (byte)uVar5 >> 7, iVar29 != 0 &&
        (0x20 < (uint)(CONCAT44(0 >> bVar34,
                                (iVar42 + 0x3f >> 6) * ((uint)(iVar37 + 0x3f >> 6) >> bVar34) +
                                uVar38 + -1) / (ulong)uVar38))))) {
      *(byte *)((long)__s + 0x20) = *(byte *)((long)__s + 0x20) | 8;
    }
  }
  else if (iVar37 == 1) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8 | 0x1f48001;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) =
         *(uint *)((long)__s + 0x144) & 0xfff00000 | *(uint *)(lVar9 + 0xe98) & 0xfffff;
    uVar38 = (uint)(*(int *)(lVar9 + 0xe9c) != 0) << 0x1e;
    *(uint *)((long)__s + 0xe0) = *(uint *)((long)__s + 0xe0) & 0xbfffffff | uVar38;
    *(uint *)((long)__s + 0x20) = *(uint *)((long)__s + 0x20) & 0xfffffff7 | uVar38 >> 0x1b;
  }
  else if (iVar37 == 0) {
    *(uint *)((long)__s + 0x140) = *(uint *)((long)__s + 0x140) & 0x80007ff8;
    *(uint *)((long)__s + 0x148) = *(uint *)((long)__s + 0x148) & 0xfff00000;
    *(uint *)((long)__s + 0x144) = *(uint *)((long)__s + 0x144) & 0xfff00000;
    *(byte *)((long)__s + 0xe3) = *(byte *)((long)__s + 0xe3) & 0xbf;
  }
  else {
    _mpp_log_l(4,"hal_h265e_v580","invalide slice split mode %d\n","vepu580_setup_split");
  }
  *(undefined4 *)(lVar9 + 0xe90) = 0;
  if (((byte)hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","leave\n","vepu580_setup_split");
  }
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v580","(%d) leave\n",(char *)0x0,0xb07);
  }
  return MPP_OK;
}

Assistant:

MPP_RET hal_h265e_v580_gen_regs(void *hal, HalEncTask *task)
{
    H265eV580HalContext *ctx = (H265eV580HalContext *)hal;
    HalEncTask *enc_task = task;
    EncRcTask *rc_task = enc_task->rc_task;
    EncFrmStatus *frm = &rc_task->frm;
    H265eSyntax_new *syn = ctx->syn;
    Vepu580H265eFrmCfg *frm_cfg = ctx->frm;
    H265eV580RegSet *regs = frm_cfg->regs_set[0];
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 pic_wd64, pic_h64;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    hevc_vepu580_control_cfg *reg_ctl = &regs->reg_ctl;
    hevc_vepu580_base        *reg_base = &regs->reg_base;
    hevc_vepu580_rc_klut *reg_klut = &regs->reg_rc_klut;
    MppEncCfgSet *cfg = ctx->cfg;

    hal_h265e_enter();
    pic_width_align8 = (syn->pp.pic_width + 7) & (~7);
    pic_height_align8 = (syn->pp.pic_height + 7) & (~7);
    pic_wd64 = (syn->pp.pic_width + 63) / 64;
    pic_h64 = (syn->pp.pic_height + 63) / 64;

    hal_h265e_dbg_simple("frame %d | type %d | start gen regs",
                         frm_cfg->frame_count, ctx->frame_type);

    memset(regs, 0, sizeof(H265eV580RegSet));

    if (ctx->task_cnt > 1)
        setup_vepu580_dual_core(ctx);

    reg_ctl->reg0004_enc_strt.lkt_num      = 0;
    reg_ctl->reg0004_enc_strt.vepu_cmd     = ctx->enc_mode;
    reg_ctl->reg0005_enc_clr.safe_clr      = 0x0;
    reg_ctl->reg0005_enc_clr.force_clr     = 0x0;

    reg_ctl->reg0008_int_en.enc_done_en         = 1;
    reg_ctl->reg0008_int_en.lkt_node_done_en    = 1;
    reg_ctl->reg0008_int_en.sclr_done_en        = 1;
    reg_ctl->reg0008_int_en.slc_done_en         = 0;
    reg_ctl->reg0008_int_en.bsf_oflw_en         = 1;
    reg_ctl->reg0008_int_en.brsp_otsd_en        = 1;
    reg_ctl->reg0008_int_en.wbus_err_en         = 1;
    reg_ctl->reg0008_int_en.rbus_err_en         = 1;
    reg_ctl->reg0008_int_en.wdg_en              = 1;
    reg_ctl->reg0008_int_en.lkt_err_int_en      = 0;

    reg_ctl->reg0012_dtrns_map.lpfw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.cmvw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.dspw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.rfpw_bus_ordr    = 0x0;
    reg_ctl->reg0012_dtrns_map.src_bus_edin     = 0x0;
    reg_ctl->reg0012_dtrns_map.meiw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.bsw_bus_edin     = 0x7;
    reg_ctl->reg0012_dtrns_map.lktr_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.roir_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.lktw_bus_edin    = 0x0;
    reg_ctl->reg0012_dtrns_map.afbc_bsize       = 0x1;
    reg_ctl->reg0012_dtrns_map.ebufw_bus_ordr   = 0x0;

    reg_ctl->reg0013_dtrns_cfg.dspr_otsd        = (ctx->frame_type == INTER_P_FRAME);
    reg_ctl->reg0013_dtrns_cfg.axi_brsp_cke     = 0x0;
    reg_ctl->reg0014_enc_wdg.vs_load_thd        = 0x1fffff;
    reg_ctl->reg0014_enc_wdg.rfp_load_thd       = 0;

    reg_ctl->reg0021_func_en.cke                = 1;
    reg_ctl->reg0021_func_en.resetn_hw_en       = 1;
    reg_ctl->reg0021_func_en.enc_done_tmvp_en   = 1;

    reg_base->reg0196_enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_wfill    = (syn->pp.pic_width & 0x7)
                                              ? (8 - (syn->pp.pic_width & 0x7)) : 0;
    reg_base->reg0196_enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    reg_base->reg0197_src_fill.pic_hfill    = (syn->pp.pic_height & 0x7)
                                              ? (8 - (syn->pp.pic_height & 0x7)) : 0;

    reg_base->reg0192_enc_pic.enc_stnd      = 1; //H265
    reg_base->reg0192_enc_pic.cur_frm_ref   = !syn->sp.non_reference_flag; //current frame will be refered
    reg_base->reg0192_enc_pic.bs_scp        = 1;
    reg_base->reg0192_enc_pic.log2_ctu_num  = ceil(log2((double)pic_wd64 * pic_h64));

    reg_base->reg0203_src_proc.src_mirr = 0;
    reg_base->reg0203_src_proc.src_rot  = 0;
    reg_base->reg0203_src_proc.txa_en   = 1;
    reg_base->reg0203_src_proc.afbcd_en = (MPP_FRAME_FMT_IS_FBC(syn->pp.mpp_format)) ? 1 : 0;

    reg_klut->klut_ofst.chrm_klut_ofst = (ctx->frame_type == INTRA_FRAME) ? 0 : 3;
    memcpy(&reg_klut->klut_wgt0, &klut_weight[0], sizeof(klut_weight));

    vepu580_h265_set_me_regs(ctx, syn, reg_base);

    reg_base->reg0232_rdo_cfg.chrm_spcl   = 1;
    reg_base->reg0232_rdo_cfg.cu_inter_e    = 0x06db;
    reg_base->reg0232_rdo_cfg.cu_intra_e    = 0xf;

    if (syn->pp.num_long_term_ref_pics_sps) {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 1;
    } else {
        reg_base->reg0232_rdo_cfg.ltm_col   = 0;
        reg_base->reg0232_rdo_cfg.ltm_idx0l0 = 0;
    }

    reg_base->reg0232_rdo_cfg.ccwa_e = 1;
    reg_base->reg0232_rdo_cfg.scl_lst_sel = syn->pp.scaling_list_enabled_flag;
    {
        RK_U32 i_nal_type = 0;

        /* TODO: extend syn->frame_coding_type definition */
        if (ctx->frame_type == INTRA_FRAME) {
            /* reset ref pictures */
            i_nal_type    = NAL_IDR_W_RADL;
        } else if (ctx->frame_type == INTER_P_FRAME ) {
            i_nal_type    = NAL_TRAIL_R;
        } else {
            i_nal_type    = NAL_TRAIL_R;
        }

        reg_base->reg0236_synt_nal.nal_unit_type    = syn->sp.temporal_id ? NAL_TSA_R : i_nal_type;
    }

    vepu580_h265_set_hw_address(ctx, task);
    vepu580_h265_set_pp_regs(regs, fmt, &ctx->cfg->prep, task);
    vepu580_h265_set_rc_regs(ctx, regs, task);
    vepu580_h265_set_slice_regs(syn, reg_base);
    vepu580_h265_set_ref_regs(syn, reg_base);

    vepu580_set_osd(&ctx->frm->osd_cfg);
    /* ROI configure */
    vepu580_h265_set_roi_regs(ctx, reg_base);
    if (frm->is_i_refresh)
        setup_intra_refresh(ctx, frm->seq_idx % ctx->cfg->rc.gop);

    if (cfg->tune.deblur_en && (!rc_task->info.complex_scene) &&
        cfg->rc.rc_mode == MPP_ENC_RC_MODE_SMTRC && task->md_info &&
        cfg->tune.scene_mode == MPP_ENC_SCENE_MODE_IPC) {
        if (MPP_OK != vepu580_setup_qpmap_buf(ctx))
            mpp_err("qpmap malloc buffer failed!\n");
    }

    /*paramet cfg*/
    vepu580_h265_global_cfg_set(ctx, regs);

    vepu580_h265e_tune_reg_patch(ctx->tune);

    vepu580_setup_split(regs, cfg, syn->pp.tiles_enabled_flag);

    hal_h265e_leave();
    return MPP_OK;
}